

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  long lVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [12];
  ulong uVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  uint uVar79;
  long lVar80;
  ulong uVar81;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar82;
  long lVar83;
  uint uVar84;
  ulong uVar85;
  byte bVar86;
  undefined4 uVar87;
  ulong uVar88;
  bool bVar89;
  float fVar114;
  float fVar115;
  vint4 bi_2;
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar118;
  float fVar120;
  float fVar122;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar116;
  undefined1 auVar103 [32];
  float fVar117;
  float fVar119;
  float fVar121;
  float fVar123;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar97 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar124;
  float fVar150;
  float fVar151;
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar152;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar128 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar153;
  float fVar175;
  float fVar176;
  vint4 ai;
  undefined1 auVar156 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  float fVar177;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar178;
  float fVar196;
  float fVar197;
  vint4 ai_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar198;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar199;
  float fVar214;
  float fVar215;
  undefined1 auVar200 [16];
  float fVar216;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [28];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  vint4 bi;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [28];
  float fVar235;
  float fVar236;
  undefined1 auVar225 [32];
  float fVar234;
  float fVar238;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar240;
  undefined1 auVar229 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar247;
  float fVar250;
  vint4 ai_1;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  float fVar249;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar261;
  float fVar263;
  float fVar264;
  undefined1 auVar245 [32];
  float fVar256;
  float fVar259;
  float fVar262;
  undefined1 auVar246 [64];
  float fVar265;
  float fVar272;
  float fVar273;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar274;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar271 [64];
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar303 [16];
  float fVar310;
  float fVar311;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [64];
  float fVar312;
  float fVar321;
  undefined1 auVar313 [32];
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar314 [64];
  float fVar322;
  float fVar333;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [64];
  float fVar334;
  float fVar340;
  float fVar341;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar346;
  float fVar347;
  float fVar351;
  float fVar353;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  float fVar352;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 auVar350 [32];
  undefined1 auVar363 [16];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar367;
  float fVar368;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d2c;
  undefined1 local_d20 [8];
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  undefined1 local_ce0 [8];
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  undefined1 local_c60 [8];
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 local_b50 [8];
  float fStack_b48;
  float fStack_b44;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined1 (*local_b10) [16];
  undefined1 (*local_b08) [16];
  undefined1 (*local_b00) [32];
  ulong local_af8;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [16];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_9f0 [16];
  Primitive *local_9e0;
  Primitive *local_9d8;
  ulong local_9d0;
  ulong local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [16];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  RTCHitN local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar339 [64];
  
  PVar1 = prim[1];
  uVar85 = (ulong)(byte)PVar1;
  local_9e0 = prim + uVar85 * 0x19 + 0x16;
  auVar127 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar127 = vinsertps_avx(auVar127,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar178 = *(float *)(prim + uVar85 * 0x19 + 0x12);
  auVar127 = vsubps_avx(auVar127,*(undefined1 (*) [16])(prim + uVar85 * 0x19 + 6));
  auVar125._0_4_ = fVar178 * auVar127._0_4_;
  auVar125._4_4_ = fVar178 * auVar127._4_4_;
  auVar125._8_4_ = fVar178 * auVar127._8_4_;
  auVar125._12_4_ = fVar178 * auVar127._12_4_;
  auVar266._0_4_ = fVar178 * auVar6._0_4_;
  auVar266._4_4_ = fVar178 * auVar6._4_4_;
  auVar266._8_4_ = fVar178 * auVar6._8_4_;
  auVar266._12_4_ = fVar178 * auVar6._12_4_;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 4 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xb + 6)));
  auVar219 = vcvtdq2ps_avx(auVar219);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xc + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0xd + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x12 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x13 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 * 0x14 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar90 = vshufps_avx(auVar266,auVar266,0);
  auVar126 = vshufps_avx(auVar266,auVar266,0x55);
  auVar97 = vshufps_avx(auVar266,auVar266,0xaa);
  fVar178 = auVar97._0_4_;
  fVar199 = auVar97._4_4_;
  fVar196 = auVar97._8_4_;
  fVar214 = auVar97._12_4_;
  fVar278 = auVar126._0_4_;
  fVar286 = auVar126._4_4_;
  fVar289 = auVar126._8_4_;
  fVar292 = auVar126._12_4_;
  fVar197 = auVar90._0_4_;
  fVar215 = auVar90._4_4_;
  fVar198 = auVar90._8_4_;
  fVar216 = auVar90._12_4_;
  auVar335._0_4_ = fVar197 * auVar127._0_4_ + fVar278 * auVar6._0_4_ + fVar178 * auVar14._0_4_;
  auVar335._4_4_ = fVar215 * auVar127._4_4_ + fVar286 * auVar6._4_4_ + fVar199 * auVar14._4_4_;
  auVar335._8_4_ = fVar198 * auVar127._8_4_ + fVar289 * auVar6._8_4_ + fVar196 * auVar14._8_4_;
  auVar335._12_4_ = fVar216 * auVar127._12_4_ + fVar292 * auVar6._12_4_ + fVar214 * auVar14._12_4_;
  auVar348._0_4_ = fVar197 * auVar219._0_4_ + fVar278 * auVar15._0_4_ + auVar156._0_4_ * fVar178;
  auVar348._4_4_ = fVar215 * auVar219._4_4_ + fVar286 * auVar15._4_4_ + auVar156._4_4_ * fVar199;
  auVar348._8_4_ = fVar198 * auVar219._8_4_ + fVar289 * auVar15._8_4_ + auVar156._8_4_ * fVar196;
  auVar348._12_4_ = fVar216 * auVar219._12_4_ + fVar292 * auVar15._12_4_ + auVar156._12_4_ * fVar214
  ;
  auVar267._0_4_ = fVar197 * auVar95._0_4_ + fVar278 * auVar91._0_4_ + auVar94._0_4_ * fVar178;
  auVar267._4_4_ = fVar215 * auVar95._4_4_ + fVar286 * auVar91._4_4_ + auVar94._4_4_ * fVar199;
  auVar267._8_4_ = fVar198 * auVar95._8_4_ + fVar289 * auVar91._8_4_ + auVar94._8_4_ * fVar196;
  auVar267._12_4_ = fVar216 * auVar95._12_4_ + fVar292 * auVar91._12_4_ + auVar94._12_4_ * fVar214;
  auVar90 = vshufps_avx(auVar125,auVar125,0);
  auVar126 = vshufps_avx(auVar125,auVar125,0x55);
  auVar97 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar178 = auVar97._0_4_;
  fVar199 = auVar97._4_4_;
  fVar196 = auVar97._8_4_;
  fVar214 = auVar97._12_4_;
  fVar278 = auVar126._0_4_;
  fVar286 = auVar126._4_4_;
  fVar289 = auVar126._8_4_;
  fVar292 = auVar126._12_4_;
  fVar197 = auVar90._0_4_;
  fVar215 = auVar90._4_4_;
  fVar198 = auVar90._8_4_;
  fVar216 = auVar90._12_4_;
  auVar217._0_4_ = fVar197 * auVar127._0_4_ + fVar278 * auVar6._0_4_ + fVar178 * auVar14._0_4_;
  auVar217._4_4_ = fVar215 * auVar127._4_4_ + fVar286 * auVar6._4_4_ + fVar199 * auVar14._4_4_;
  auVar217._8_4_ = fVar198 * auVar127._8_4_ + fVar289 * auVar6._8_4_ + fVar196 * auVar14._8_4_;
  auVar217._12_4_ = fVar216 * auVar127._12_4_ + fVar292 * auVar6._12_4_ + fVar214 * auVar14._12_4_;
  auVar126._0_4_ = fVar197 * auVar219._0_4_ + auVar156._0_4_ * fVar178 + fVar278 * auVar15._0_4_;
  auVar126._4_4_ = fVar215 * auVar219._4_4_ + auVar156._4_4_ * fVar199 + fVar286 * auVar15._4_4_;
  auVar126._8_4_ = fVar198 * auVar219._8_4_ + auVar156._8_4_ * fVar196 + fVar289 * auVar15._8_4_;
  auVar126._12_4_ = fVar216 * auVar219._12_4_ + auVar156._12_4_ * fVar214 + fVar292 * auVar15._12_4_
  ;
  auVar90._0_4_ = fVar278 * auVar91._0_4_ + auVar94._0_4_ * fVar178 + fVar197 * auVar95._0_4_;
  auVar90._4_4_ = fVar286 * auVar91._4_4_ + auVar94._4_4_ * fVar199 + fVar215 * auVar95._4_4_;
  auVar90._8_4_ = fVar289 * auVar91._8_4_ + auVar94._8_4_ * fVar196 + fVar198 * auVar95._8_4_;
  auVar90._12_4_ = fVar292 * auVar91._12_4_ + auVar94._12_4_ * fVar214 + fVar216 * auVar95._12_4_;
  auVar241._8_4_ = 0x7fffffff;
  auVar241._0_8_ = 0x7fffffff7fffffff;
  auVar241._12_4_ = 0x7fffffff;
  auVar127 = vandps_avx(auVar335,auVar241);
  auVar179._8_4_ = 0x219392ef;
  auVar179._0_8_ = 0x219392ef219392ef;
  auVar179._12_4_ = 0x219392ef;
  auVar127 = vcmpps_avx(auVar127,auVar179,1);
  auVar6 = vblendvps_avx(auVar335,auVar179,auVar127);
  auVar127 = vandps_avx(auVar348,auVar241);
  auVar127 = vcmpps_avx(auVar127,auVar179,1);
  auVar14 = vblendvps_avx(auVar348,auVar179,auVar127);
  auVar127 = vandps_avx(auVar267,auVar241);
  auVar127 = vcmpps_avx(auVar127,auVar179,1);
  auVar127 = vblendvps_avx(auVar267,auVar179,auVar127);
  auVar219 = vrcpps_avx(auVar6);
  fVar278 = auVar219._0_4_;
  auVar97._0_4_ = fVar278 * auVar6._0_4_;
  fVar286 = auVar219._4_4_;
  auVar97._4_4_ = fVar286 * auVar6._4_4_;
  fVar289 = auVar219._8_4_;
  auVar97._8_4_ = fVar289 * auVar6._8_4_;
  fVar292 = auVar219._12_4_;
  auVar97._12_4_ = fVar292 * auVar6._12_4_;
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = 0x3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar6 = vsubps_avx(auVar268,auVar97);
  fVar278 = fVar278 + fVar278 * auVar6._0_4_;
  fVar286 = fVar286 + fVar286 * auVar6._4_4_;
  fVar289 = fVar289 + fVar289 * auVar6._8_4_;
  fVar292 = fVar292 + fVar292 * auVar6._12_4_;
  auVar6 = vrcpps_avx(auVar14);
  fVar178 = auVar6._0_4_;
  auVar180._0_4_ = fVar178 * auVar14._0_4_;
  fVar196 = auVar6._4_4_;
  auVar180._4_4_ = fVar196 * auVar14._4_4_;
  fVar197 = auVar6._8_4_;
  auVar180._8_4_ = fVar197 * auVar14._8_4_;
  fVar198 = auVar6._12_4_;
  auVar180._12_4_ = fVar198 * auVar14._12_4_;
  auVar6 = vsubps_avx(auVar268,auVar180);
  fVar178 = fVar178 + fVar178 * auVar6._0_4_;
  fVar196 = fVar196 + fVar196 * auVar6._4_4_;
  fVar197 = fVar197 + fVar197 * auVar6._8_4_;
  fVar198 = fVar198 + fVar198 * auVar6._12_4_;
  auVar6 = vrcpps_avx(auVar127);
  fVar199 = auVar6._0_4_;
  auVar200._0_4_ = fVar199 * auVar127._0_4_;
  fVar214 = auVar6._4_4_;
  auVar200._4_4_ = fVar214 * auVar127._4_4_;
  fVar215 = auVar6._8_4_;
  auVar200._8_4_ = fVar215 * auVar127._8_4_;
  fVar216 = auVar6._12_4_;
  auVar200._12_4_ = fVar216 * auVar127._12_4_;
  auVar6 = vsubps_avx(auVar268,auVar200);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar85 * 7 + 6);
  auVar127 = vpmovsxwd_avx(auVar127);
  fVar199 = fVar199 + fVar199 * auVar6._0_4_;
  fVar214 = fVar214 + fVar214 * auVar6._4_4_;
  fVar215 = fVar215 + fVar215 * auVar6._8_4_;
  fVar216 = fVar216 + fVar216 * auVar6._12_4_;
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar217);
  auVar154._0_4_ = fVar278 * auVar127._0_4_;
  auVar154._4_4_ = fVar286 * auVar127._4_4_;
  auVar154._8_4_ = fVar289 * auVar127._8_4_;
  auVar154._12_4_ = fVar292 * auVar127._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar85 * 9 + 6);
  auVar127 = vpmovsxwd_avx(auVar6);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar6 = vsubps_avx(auVar127,auVar217);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar85 * 0xe + 6);
  auVar127 = vpmovsxwd_avx(auVar14);
  auVar218._0_4_ = fVar278 * auVar6._0_4_;
  auVar218._4_4_ = fVar286 * auVar6._4_4_;
  auVar218._8_4_ = fVar289 * auVar6._8_4_;
  auVar218._12_4_ = fVar292 * auVar6._12_4_;
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar242._0_4_ = auVar127._0_4_ * fVar178;
  auVar242._4_4_ = auVar127._4_4_ * fVar196;
  auVar242._8_4_ = auVar127._8_4_ * fVar197;
  auVar242._12_4_ = auVar127._12_4_ * fVar198;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar127 = vpmovsxwd_avx(auVar219);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar126);
  auVar94._0_4_ = fVar178 * auVar127._0_4_;
  auVar94._4_4_ = fVar196 * auVar127._4_4_;
  auVar94._8_4_ = fVar197 * auVar127._8_4_;
  auVar94._12_4_ = fVar198 * auVar127._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar85 * 0x15 + 6);
  auVar127 = vpmovsxwd_avx(auVar15);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar6 = vsubps_avx(auVar127,auVar90);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar85 * 0x17 + 6);
  auVar127 = vpmovsxwd_avx(auVar156);
  auVar181._0_4_ = auVar6._0_4_ * fVar199;
  auVar181._4_4_ = auVar6._4_4_ * fVar214;
  auVar181._8_4_ = auVar6._8_4_ * fVar215;
  auVar181._12_4_ = auVar6._12_4_ * fVar216;
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,auVar90);
  auVar95._0_4_ = auVar127._0_4_ * fVar199;
  auVar95._4_4_ = auVar127._4_4_ * fVar214;
  auVar95._8_4_ = auVar127._8_4_ * fVar215;
  auVar95._12_4_ = auVar127._12_4_ * fVar216;
  auVar127 = vpminsd_avx(auVar154,auVar218);
  auVar6 = vpminsd_avx(auVar242,auVar94);
  auVar127 = vmaxps_avx(auVar127,auVar6);
  auVar6 = vpminsd_avx(auVar181,auVar95);
  uVar87 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar303._4_4_ = uVar87;
  auVar303._0_4_ = uVar87;
  auVar303._8_4_ = uVar87;
  auVar303._12_4_ = uVar87;
  auVar6 = vmaxps_avx(auVar6,auVar303);
  auVar127 = vmaxps_avx(auVar127,auVar6);
  local_800._0_4_ = auVar127._0_4_ * 0.99999964;
  local_800._4_4_ = auVar127._4_4_ * 0.99999964;
  local_800._8_4_ = auVar127._8_4_ * 0.99999964;
  local_800._12_4_ = auVar127._12_4_ * 0.99999964;
  auVar127 = vpmaxsd_avx(auVar154,auVar218);
  auVar6 = vpmaxsd_avx(auVar242,auVar94);
  auVar127 = vminps_avx(auVar127,auVar6);
  auVar6 = vpmaxsd_avx(auVar181,auVar95);
  uVar87 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar155._4_4_ = uVar87;
  auVar155._0_4_ = uVar87;
  auVar155._8_4_ = uVar87;
  auVar155._12_4_ = uVar87;
  auVar6 = vminps_avx(auVar6,auVar155);
  auVar127 = vminps_avx(auVar127,auVar6);
  auVar6 = vpshufd_avx(ZEXT116((byte)PVar1),0);
  auVar6 = vpcmpgtd_avx(auVar6,_DAT_01f4ad30);
  auVar91._0_4_ = auVar127._0_4_ * 1.0000004;
  auVar91._4_4_ = auVar127._4_4_ * 1.0000004;
  auVar91._8_4_ = auVar127._8_4_ * 1.0000004;
  auVar91._12_4_ = auVar127._12_4_ * 1.0000004;
  auVar127 = vcmpps_avx(local_800,auVar91,2);
  auVar127 = vandps_avx(auVar127,auVar6);
  uVar87 = vmovmskps_avx(auVar127);
  local_9c8 = CONCAT44((int)((ulong)prim >> 0x20),uVar87);
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  local_5c0 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  uVar84 = 1 << ((byte)k & 0x1f);
  local_b00 = (undefined1 (*) [32])&local_700;
  local_b08 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar84 & 0xf) << 4));
  local_b10 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar84 >> 4) * 0x10);
  auVar309 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  local_9d8 = prim;
LAB_007b6bdf:
  if (local_9c8 == 0) {
LAB_007b9790:
    return local_9c8 != 0;
  }
  lVar80 = 0;
  if (local_9c8 != 0) {
    for (; (local_9c8 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
    }
  }
  local_9d0 = local_9c8 - 1 & local_9c8;
  lVar83 = lVar80 * 0x40;
  lVar5 = 0;
  if (local_9d0 != 0) {
    for (; (local_9d0 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  local_af8 = (ulong)*(uint *)(local_9d8 + 2);
  auVar127 = *(undefined1 (*) [16])(local_9e0 + lVar83);
  if (((local_9d0 != 0) && (uVar85 = local_9d0 - 1 & local_9d0, uVar85 != 0)) &&
     (lVar5 = 0, uVar85 != 0)) {
    for (; (uVar85 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_9e0 + lVar83 + 0x10);
  auVar14 = *(undefined1 (*) [16])(local_9e0 + lVar83 + 0x20);
  auVar219 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar156 = vinsertps_avx(auVar219,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar178 = *(float *)(ray + k * 4 + 0x80);
  auVar336._4_4_ = fVar178;
  auVar336._0_4_ = fVar178;
  auVar336._8_4_ = fVar178;
  auVar336._12_4_ = fVar178;
  fStack_8d0 = fVar178;
  _local_8e0 = auVar336;
  fStack_8cc = fVar178;
  fStack_8c8 = fVar178;
  fStack_8c4 = fVar178;
  auVar339 = ZEXT3264(_local_8e0);
  auVar219 = *(undefined1 (*) [16])(local_9e0 + lVar83 + 0x30);
  fVar199 = *(float *)(ray + k * 4 + 0xa0);
  auVar349._4_4_ = fVar199;
  auVar349._0_4_ = fVar199;
  auVar349._8_4_ = fVar199;
  auVar349._12_4_ = fVar199;
  fStack_8f0 = fVar199;
  _local_900 = auVar349;
  fStack_8ec = fVar199;
  fStack_8e8 = fVar199;
  fStack_8e4 = fVar199;
  auVar15 = vunpcklps_avx(auVar336,auVar349);
  fVar196 = *(float *)(ray + k * 4 + 0xc0);
  auVar363._4_4_ = fVar196;
  auVar363._0_4_ = fVar196;
  auVar363._8_4_ = fVar196;
  auVar363._12_4_ = fVar196;
  fStack_910 = fVar196;
  _local_920 = auVar363;
  fStack_90c = fVar196;
  fStack_908 = fVar196;
  fStack_904 = fVar196;
  _local_a70 = vinsertps_avx(auVar15,auVar363,0x28);
  auVar314 = ZEXT1664(_local_a70);
  auVar92._0_4_ = (auVar127._0_4_ + auVar6._0_4_ + auVar14._0_4_ + auVar219._0_4_) * 0.25;
  auVar92._4_4_ = (auVar127._4_4_ + auVar6._4_4_ + auVar14._4_4_ + auVar219._4_4_) * 0.25;
  auVar92._8_4_ = (auVar127._8_4_ + auVar6._8_4_ + auVar14._8_4_ + auVar219._8_4_) * 0.25;
  auVar92._12_4_ = (auVar127._12_4_ + auVar6._12_4_ + auVar14._12_4_ + auVar219._12_4_) * 0.25;
  auVar15 = vsubps_avx(auVar92,auVar156);
  auVar15 = vdpps_avx(auVar15,_local_a70,0x7f);
  local_a80 = vdpps_avx(_local_a70,_local_a70,0x7f);
  auVar326 = ZEXT1664(local_a80);
  auVar95 = vrcpss_avx(local_a80,local_a80);
  fVar214 = auVar15._0_4_ * auVar95._0_4_ * (2.0 - local_a80._0_4_ * auVar95._0_4_);
  auVar271 = ZEXT464((uint)fVar214);
  auVar95 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
  auVar201._0_4_ = auVar156._0_4_ + local_a70._0_4_ * auVar95._0_4_;
  auVar201._4_4_ = auVar156._4_4_ + local_a70._4_4_ * auVar95._4_4_;
  auVar201._8_4_ = auVar156._8_4_ + local_a70._8_4_ * auVar95._8_4_;
  auVar201._12_4_ = auVar156._12_4_ + local_a70._12_4_ * auVar95._12_4_;
  auVar15 = vblendps_avx(auVar201,_DAT_01f45a50,8);
  _local_b50 = vsubps_avx(auVar127,auVar15);
  auVar246 = ZEXT1664(_local_b50);
  _local_b60 = vsubps_avx(auVar14,auVar15);
  _local_b70 = vsubps_avx(auVar6,auVar15);
  _local_b80 = vsubps_avx(auVar219,auVar15);
  auVar6 = vshufps_avx(_local_b50,_local_b50,0);
  auVar127 = vshufps_avx(_local_b50,_local_b50,0x55);
  register0x00001250 = auVar127;
  _local_1e0 = auVar127;
  auVar127 = vshufps_avx(_local_b50,_local_b50,0xaa);
  register0x00001250 = auVar127;
  _local_200 = auVar127;
  auVar127 = vshufps_avx(_local_b50,_local_b50,0xff);
  register0x00001290 = auVar127;
  _local_220 = auVar127;
  auVar127 = vshufps_avx(_local_b70,_local_b70,0);
  register0x00001290 = auVar127;
  _local_240 = auVar127;
  auVar127 = vshufps_avx(_local_b70,_local_b70,0x55);
  register0x00001290 = auVar127;
  _local_260 = auVar127;
  auVar127 = vshufps_avx(_local_b70,_local_b70,0xaa);
  register0x00001290 = auVar127;
  _local_280 = auVar127;
  auVar127 = vshufps_avx(_local_b70,_local_b70,0xff);
  register0x00001290 = auVar127;
  _local_4a0 = auVar127;
  auVar127 = vshufps_avx(_local_b60,_local_b60,0);
  register0x00001290 = auVar127;
  _local_4c0 = auVar127;
  auVar127 = vshufps_avx(_local_b60,_local_b60,0x55);
  register0x00001290 = auVar127;
  _local_4e0 = auVar127;
  auVar127 = vshufps_avx(_local_b60,_local_b60,0xaa);
  register0x00001290 = auVar127;
  _local_500 = auVar127;
  auVar127 = vshufps_avx(_local_b60,_local_b60,0xff);
  register0x00001290 = auVar127;
  _local_520 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0);
  register0x00001290 = auVar127;
  _local_540 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0x55);
  register0x00001290 = auVar127;
  _local_560 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0xaa);
  register0x00001290 = auVar127;
  _local_580 = auVar127;
  auVar127 = vshufps_avx(_local_b80,_local_b80,0xff);
  register0x00001290 = auVar127;
  _local_5a0 = auVar127;
  auVar127 = ZEXT416((uint)(fVar178 * fVar178 + fVar199 * fVar199 + fVar196 * fVar196));
  auVar127 = vshufps_avx(auVar127,auVar127,0);
  local_2a0._16_16_ = auVar127;
  local_2a0._0_16_ = auVar127;
  fVar178 = *(float *)(ray + k * 4 + 0x60);
  local_9f0 = ZEXT416((uint)fVar214);
  auVar127 = vshufps_avx(ZEXT416((uint)(fVar178 - fVar214)),ZEXT416((uint)(fVar178 - fVar214)),0);
  local_340._16_16_ = auVar127;
  local_340._0_16_ = auVar127;
  auVar127 = vpshufd_avx(ZEXT416(*(uint *)(local_9d8 + 2)),0);
  local_640._16_16_ = auVar127;
  local_640._0_16_ = auVar127;
  auVar127 = vpshufd_avx(ZEXT416(*(uint *)(local_9d8 + lVar80 * 4 + 6)),0);
  local_660._16_16_ = auVar127;
  local_660._0_16_ = auVar127;
  register0x00001210 = auVar95;
  _local_8c0 = auVar95;
  uVar85 = 0;
  bVar86 = 0;
  local_d2c = 1;
  local_620 = vandps_avx(auVar309._0_32_,local_2a0);
  auVar127 = vsqrtss_avx(local_a80,local_a80);
  auVar14 = vsqrtss_avx(local_a80,local_a80);
  local_7f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar225._8_4_ = 0x3f800000;
    auVar225._0_8_ = 0x3f8000003f800000;
    auVar225._12_4_ = 0x3f800000;
    auVar225._16_4_ = 0x3f800000;
    auVar225._20_4_ = 0x3f800000;
    auVar225._24_4_ = 0x3f800000;
    auVar225._28_4_ = 0x3f800000;
    auVar219 = vmovshdup_avx(local_7f0);
    auVar156 = vsubps_avx(auVar219,local_7f0);
    auVar219 = vshufps_avx(local_7f0,local_7f0,0);
    auVar167._16_16_ = auVar219;
    auVar167._0_16_ = auVar219;
    auVar15 = vshufps_avx(auVar156,auVar156,0);
    fVar124 = auVar15._0_4_;
    fVar150 = auVar15._4_4_;
    fVar151 = auVar15._8_4_;
    fVar152 = auVar15._12_4_;
    fVar153 = auVar219._0_4_;
    auVar192._0_4_ = fVar153 + fVar124 * 0.0;
    fVar175 = auVar219._4_4_;
    auVar192._4_4_ = fVar175 + fVar150 * 0.14285715;
    fVar176 = auVar219._8_4_;
    auVar192._8_4_ = fVar176 + fVar151 * 0.2857143;
    fVar177 = auVar219._12_4_;
    auVar192._12_4_ = fVar177 + fVar152 * 0.42857146;
    auVar192._16_4_ = fVar153 + fVar124 * 0.5714286;
    auVar192._20_4_ = fVar175 + fVar150 * 0.71428573;
    auVar192._24_4_ = fVar176 + fVar151 * 0.8571429;
    auVar192._28_4_ = fVar177 + fVar152;
    auVar101 = vsubps_avx(auVar225,auVar192);
    fVar199 = auVar101._0_4_;
    fVar196 = auVar101._4_4_;
    fVar214 = auVar101._8_4_;
    fVar197 = auVar101._12_4_;
    fVar215 = auVar101._16_4_;
    fVar198 = auVar101._20_4_;
    fVar216 = auVar101._24_4_;
    fVar292 = fVar199 * fVar199 * fVar199;
    fVar247 = fVar196 * fVar196 * fVar196;
    fVar250 = fVar214 * fVar214 * fVar214;
    fVar253 = fVar197 * fVar197 * fVar197;
    fVar256 = fVar215 * fVar215 * fVar215;
    fVar259 = fVar198 * fVar198 * fVar198;
    fVar262 = fVar216 * fVar216 * fVar216;
    fVar265 = auVar192._0_4_ * auVar192._0_4_ * auVar192._0_4_;
    fVar272 = auVar192._4_4_ * auVar192._4_4_ * auVar192._4_4_;
    fVar273 = auVar192._8_4_ * auVar192._8_4_ * auVar192._8_4_;
    fVar274 = auVar192._12_4_ * auVar192._12_4_ * auVar192._12_4_;
    fVar275 = auVar192._16_4_ * auVar192._16_4_ * auVar192._16_4_;
    fVar276 = auVar192._20_4_ * auVar192._20_4_ * auVar192._20_4_;
    fVar277 = auVar192._24_4_ * auVar192._24_4_ * auVar192._24_4_;
    fVar278 = auVar192._0_4_ * fVar199;
    fVar286 = auVar192._4_4_ * fVar196;
    fVar289 = auVar192._8_4_ * fVar214;
    fVar234 = auVar192._12_4_ * fVar197;
    fVar235 = auVar192._16_4_ * fVar215;
    fVar236 = auVar192._20_4_ * fVar198;
    fVar238 = auVar192._24_4_ * fVar216;
    fVar321 = auVar314._28_4_ + auVar339._28_4_;
    fVar301 = auVar271._28_4_ + 1.0 + fVar321;
    fVar310 = fVar321 + auVar246._28_4_ + auVar326._28_4_ + auVar309._28_4_;
    fVar321 = fVar292 * 0.16666667;
    fVar248 = fVar247 * 0.16666667;
    fVar251 = fVar250 * 0.16666667;
    fVar254 = fVar253 * 0.16666667;
    fVar257 = fVar256 * 0.16666667;
    fVar260 = fVar259 * 0.16666667;
    fVar263 = fVar262 * 0.16666667;
    fVar279 = (fVar265 + fVar292 * 4.0 + fVar199 * fVar278 * 12.0 + auVar192._0_4_ * fVar278 * 6.0)
              * 0.16666667;
    fVar287 = (fVar272 + fVar247 * 4.0 + fVar196 * fVar286 * 12.0 + auVar192._4_4_ * fVar286 * 6.0)
              * 0.16666667;
    fVar290 = (fVar273 + fVar250 * 4.0 + fVar214 * fVar289 * 12.0 + auVar192._8_4_ * fVar289 * 6.0)
              * 0.16666667;
    fVar293 = (fVar274 + fVar253 * 4.0 + fVar197 * fVar234 * 12.0 + auVar192._12_4_ * fVar234 * 6.0)
              * 0.16666667;
    fVar295 = (fVar275 + fVar256 * 4.0 + fVar215 * fVar235 * 12.0 + auVar192._16_4_ * fVar235 * 6.0)
              * 0.16666667;
    fVar297 = (fVar276 + fVar259 * 4.0 + fVar198 * fVar236 * 12.0 + auVar192._20_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar299 = (fVar277 + fVar262 * 4.0 + fVar216 * fVar238 * 12.0 + auVar192._24_4_ * fVar238 * 6.0)
              * 0.16666667;
    fVar292 = (fVar265 * 4.0 + fVar292 + auVar192._0_4_ * fVar278 * 12.0 + fVar199 * fVar278 * 6.0)
              * 0.16666667;
    fVar247 = (fVar272 * 4.0 + fVar247 + auVar192._4_4_ * fVar286 * 12.0 + fVar196 * fVar286 * 6.0)
              * 0.16666667;
    fVar250 = (fVar273 * 4.0 + fVar250 + auVar192._8_4_ * fVar289 * 12.0 + fVar214 * fVar289 * 6.0)
              * 0.16666667;
    fVar253 = (fVar274 * 4.0 + fVar253 + auVar192._12_4_ * fVar234 * 12.0 + fVar197 * fVar234 * 6.0)
              * 0.16666667;
    fVar256 = (fVar275 * 4.0 + fVar256 + auVar192._16_4_ * fVar235 * 12.0 + fVar215 * fVar235 * 6.0)
              * 0.16666667;
    fVar259 = (fVar276 * 4.0 + fVar259 + auVar192._20_4_ * fVar236 * 12.0 + fVar198 * fVar236 * 6.0)
              * 0.16666667;
    fVar262 = (fVar277 * 4.0 + fVar262 + auVar192._24_4_ * fVar238 * 12.0 + fVar216 * fVar238 * 6.0)
              * 0.16666667;
    fVar265 = fVar265 * 0.16666667;
    fVar272 = fVar272 * 0.16666667;
    fVar273 = fVar273 * 0.16666667;
    fVar274 = fVar274 * 0.16666667;
    fVar275 = fVar275 * 0.16666667;
    fVar276 = fVar276 * 0.16666667;
    fVar277 = fVar277 * 0.16666667;
    fVar333 = auVar326._28_4_ + 12.0;
    fVar311 = fVar310 + 12.166667;
    fVar367 = auVar6._0_4_;
    fVar368 = auVar6._4_4_;
    fVar237 = auVar6._8_4_;
    local_a40 = fVar367 * fVar321 +
                (float)local_240._0_4_ * fVar279 +
                fVar265 * (float)local_540._0_4_ + fVar292 * (float)local_4c0._0_4_;
    fStack_a3c = fVar368 * fVar248 +
                 (float)local_240._4_4_ * fVar287 +
                 fVar272 * (float)local_540._4_4_ + fVar247 * (float)local_4c0._4_4_;
    fStack_a38 = fVar237 * fVar251 +
                 fStack_238 * fVar290 + fVar273 * fStack_538 + fVar250 * fStack_4b8;
    fStack_a34 = auVar6._12_4_ * fVar254 +
                 fStack_234 * fVar293 + fVar274 * fStack_534 + fVar253 * fStack_4b4;
    fStack_a30 = fVar367 * fVar257 +
                 fStack_230 * fVar295 + fVar275 * fStack_530 + fVar256 * fStack_4b0;
    fStack_a2c = fVar368 * fVar260 +
                 fStack_22c * fVar297 + fVar276 * fStack_52c + fVar259 * fStack_4ac;
    fStack_a28 = fVar237 * fVar263 +
                 fStack_228 * fVar299 + fVar277 * fStack_528 + fVar262 * fStack_4a8;
    fStack_a24 = fVar301 + fVar311;
    fVar280 = (float)local_1e0._0_4_ * fVar321 +
              fVar279 * (float)local_260._0_4_ +
              fVar265 * (float)local_560._0_4_ + fVar292 * (float)local_4e0._0_4_;
    fVar288 = (float)local_1e0._4_4_ * fVar248 +
              fVar287 * (float)local_260._4_4_ +
              fVar272 * (float)local_560._4_4_ + fVar247 * (float)local_4e0._4_4_;
    fVar291 = fStack_1d8 * fVar251 +
              fVar290 * fStack_258 + fVar273 * fStack_558 + fVar250 * fStack_4d8;
    fVar294 = fStack_1d4 * fVar254 +
              fVar293 * fStack_254 + fVar274 * fStack_554 + fVar253 * fStack_4d4;
    fVar296 = fStack_1d0 * fVar257 +
              fVar295 * fStack_250 + fVar275 * fStack_550 + fVar256 * fStack_4d0;
    fVar298 = fStack_1cc * fVar260 +
              fVar297 * fStack_24c + fVar276 * fStack_54c + fVar259 * fStack_4cc;
    fVar300 = fStack_1c8 * fVar263 +
              fVar299 * fStack_248 + fVar277 * fStack_548 + fVar262 * fStack_4c8;
    fVar302 = fStack_a24 + fVar333 + 12.166667;
    local_d20._0_4_ =
         (float)local_200._0_4_ * fVar321 +
         (float)local_280._0_4_ * fVar279 +
         fVar265 * (float)local_580._0_4_ + fVar292 * (float)local_500._0_4_;
    local_d20._4_4_ =
         (float)local_200._4_4_ * fVar248 +
         (float)local_280._4_4_ * fVar287 +
         fVar272 * (float)local_580._4_4_ + fVar247 * (float)local_500._4_4_;
    fStack_d18 = fStack_1f8 * fVar251 +
                 fStack_278 * fVar290 + fVar273 * fStack_578 + fVar250 * fStack_4f8;
    fStack_d14 = fStack_1f4 * fVar254 +
                 fStack_274 * fVar293 + fVar274 * fStack_574 + fVar253 * fStack_4f4;
    fStack_d10 = fStack_1f0 * fVar257 +
                 fStack_270 * fVar295 + fVar275 * fStack_570 + fVar256 * fStack_4f0;
    fStack_d0c = fStack_1ec * fVar260 +
                 fStack_26c * fVar297 + fVar276 * fStack_56c + fVar259 * fStack_4ec;
    fStack_d08 = fStack_1e8 * fVar263 +
                 fStack_268 * fVar299 + fVar277 * fStack_568 + fVar262 * fStack_4e8;
    fStack_d04 = fVar302 + fVar333 + auVar339._28_4_ + 12.0;
    local_b40._0_4_ =
         (float)local_220._0_4_ * fVar321 +
         fVar279 * (float)local_4a0._0_4_ +
         fVar292 * (float)local_520._0_4_ + fVar265 * (float)local_5a0._0_4_;
    local_b40._4_4_ =
         (float)local_220._4_4_ * fVar248 +
         fVar287 * (float)local_4a0._4_4_ +
         fVar247 * (float)local_520._4_4_ + fVar272 * (float)local_5a0._4_4_;
    fStack_b38 = fStack_218 * fVar251 +
                 fVar290 * fStack_498 + fVar250 * fStack_518 + fVar273 * fStack_598;
    fStack_b34 = fStack_214 * fVar254 +
                 fVar293 * fStack_494 + fVar253 * fStack_514 + fVar274 * fStack_594;
    fStack_b30 = fStack_210 * fVar257 +
                 fVar295 * fStack_490 + fVar256 * fStack_510 + fVar275 * fStack_590;
    fStack_b2c = fStack_20c * fVar260 +
                 fVar297 * fStack_48c + fVar259 * fStack_50c + fVar276 * fStack_58c;
    fStack_b28 = fStack_208 * fVar263 +
                 fVar299 * fStack_488 + fVar262 * fStack_508 + fVar277 * fStack_588;
    fStack_b24 = auVar246._28_4_ + fVar301 + fVar310 + auVar271._28_4_;
    auVar19._4_4_ = auVar192._4_4_ * -auVar192._4_4_;
    auVar19._0_4_ = auVar192._0_4_ * -auVar192._0_4_;
    auVar19._8_4_ = auVar192._8_4_ * -auVar192._8_4_;
    auVar19._12_4_ = auVar192._12_4_ * -auVar192._12_4_;
    auVar19._16_4_ = auVar192._16_4_ * -auVar192._16_4_;
    auVar19._20_4_ = auVar192._20_4_ * -auVar192._20_4_;
    auVar19._24_4_ = auVar192._24_4_ * -auVar192._24_4_;
    auVar19._28_4_ = auVar192._28_4_;
    auVar20._4_4_ = fVar286 * 4.0;
    auVar20._0_4_ = fVar278 * 4.0;
    auVar20._8_4_ = fVar289 * 4.0;
    auVar20._12_4_ = fVar234 * 4.0;
    auVar20._16_4_ = fVar235 * 4.0;
    auVar20._20_4_ = fVar236 * 4.0;
    auVar20._24_4_ = fVar238 * 4.0;
    auVar20._28_4_ = 0x3f800000;
    auVar101 = vsubps_avx(auVar19,auVar20);
    fVar257 = fVar199 * -fVar199 * 0.5;
    fVar262 = fVar196 * -fVar196 * 0.5;
    fVar263 = fVar214 * -fVar214 * 0.5;
    fVar265 = fVar197 * -fVar197 * 0.5;
    fVar272 = fVar215 * -fVar215 * 0.5;
    fVar273 = fVar198 * -fVar198 * 0.5;
    fVar274 = fVar216 * -fVar216 * 0.5;
    fVar247 = auVar101._0_4_ * 0.5;
    fVar248 = auVar101._4_4_ * 0.5;
    fVar251 = auVar101._8_4_ * 0.5;
    fVar253 = auVar101._12_4_ * 0.5;
    fVar254 = auVar101._16_4_ * 0.5;
    fVar259 = auVar101._20_4_ * 0.5;
    fVar260 = auVar101._24_4_ * 0.5;
    fVar278 = (fVar199 * fVar199 + fVar278 * 4.0) * 0.5;
    fVar292 = (fVar196 * fVar196 + fVar286 * 4.0) * 0.5;
    fVar321 = (fVar214 * fVar214 + fVar289 * 4.0) * 0.5;
    fVar234 = (fVar197 * fVar197 + fVar234 * 4.0) * 0.5;
    fVar235 = (fVar215 * fVar215 + fVar235 * 4.0) * 0.5;
    fVar250 = (fVar198 * fVar198 + fVar236 * 4.0) * 0.5;
    fVar238 = (fVar216 * fVar216 + fVar238 * 4.0) * 0.5;
    fVar199 = auVar192._0_4_ * auVar192._0_4_ * 0.5;
    fVar196 = auVar192._4_4_ * auVar192._4_4_ * 0.5;
    fVar214 = auVar192._8_4_ * auVar192._8_4_ * 0.5;
    fVar197 = auVar192._12_4_ * auVar192._12_4_ * 0.5;
    fVar215 = auVar192._16_4_ * auVar192._16_4_ * 0.5;
    fVar198 = auVar192._20_4_ * auVar192._20_4_ * 0.5;
    fVar289 = auVar192._24_4_ * auVar192._24_4_ * 0.5;
    auVar219 = vpermilps_avx(ZEXT416((uint)(auVar156._0_4_ * 0.04761905)),0);
    fVar216 = auVar219._0_4_;
    fVar334 = fVar216 * (fVar367 * fVar257 +
                        (float)local_240._0_4_ * fVar247 +
                        fVar278 * (float)local_4c0._0_4_ + fVar199 * (float)local_540._0_4_);
    fVar286 = auVar219._4_4_;
    fVar340 = fVar286 * (fVar368 * fVar262 +
                        (float)local_240._4_4_ * fVar248 +
                        fVar292 * (float)local_4c0._4_4_ + fVar196 * (float)local_540._4_4_);
    auVar25._4_4_ = fVar340;
    auVar25._0_4_ = fVar334;
    fVar236 = auVar219._8_4_;
    fVar341 = fVar236 * (fVar237 * fVar263 +
                        fStack_238 * fVar251 + fVar321 * fStack_4b8 + fVar214 * fStack_538);
    auVar25._8_4_ = fVar341;
    fVar256 = auVar219._12_4_;
    fVar342 = fVar256 * (auVar6._12_4_ * fVar265 +
                        fStack_234 * fVar253 + fVar234 * fStack_4b4 + fVar197 * fStack_534);
    auVar25._12_4_ = fVar342;
    fVar343 = fVar216 * (fVar367 * fVar272 +
                        fStack_230 * fVar254 + fVar235 * fStack_4b0 + fVar215 * fStack_530);
    auVar25._16_4_ = fVar343;
    fVar344 = fVar286 * (fVar368 * fVar273 +
                        fStack_22c * fVar259 + fVar250 * fStack_4ac + fVar198 * fStack_52c);
    auVar25._20_4_ = fVar344;
    fVar345 = fVar236 * (fVar237 * fVar274 +
                        fStack_228 * fVar260 + fVar238 * fStack_4a8 + fVar289 * fStack_528);
    auVar25._24_4_ = fVar345;
    auVar25._28_4_ = uStack_1c4;
    fVar322 = fVar216 * ((float)local_1e0._0_4_ * fVar257 +
                        (float)local_260._0_4_ * fVar247 +
                        fVar278 * (float)local_4e0._0_4_ + fVar199 * (float)local_560._0_4_);
    fVar327 = fVar286 * ((float)local_1e0._4_4_ * fVar262 +
                        (float)local_260._4_4_ * fVar248 +
                        fVar292 * (float)local_4e0._4_4_ + fVar196 * (float)local_560._4_4_);
    auVar24._4_4_ = fVar327;
    auVar24._0_4_ = fVar322;
    fVar328 = fVar236 * (fStack_1d8 * fVar263 +
                        fStack_258 * fVar251 + fVar321 * fStack_4d8 + fVar214 * fStack_558);
    auVar24._8_4_ = fVar328;
    fVar329 = fVar256 * (fStack_1d4 * fVar265 +
                        fStack_254 * fVar253 + fVar234 * fStack_4d4 + fVar197 * fStack_554);
    auVar24._12_4_ = fVar329;
    fVar330 = fVar216 * (fStack_1d0 * fVar272 +
                        fStack_250 * fVar254 + fVar235 * fStack_4d0 + fVar215 * fStack_550);
    auVar24._16_4_ = fVar330;
    fVar331 = fVar286 * (fStack_1cc * fVar273 +
                        fStack_24c * fVar259 + fVar250 * fStack_4cc + fVar198 * fStack_54c);
    auVar24._20_4_ = fVar331;
    fVar332 = fVar236 * (fStack_1c8 * fVar274 +
                        fStack_248 * fVar260 + fVar238 * fStack_4c8 + fVar289 * fStack_548);
    auVar24._24_4_ = fVar332;
    auVar24._28_4_ = fStack_204;
    fVar346 = fVar216 * ((float)local_200._0_4_ * fVar257 +
                        fVar199 * (float)local_580._0_4_ + fVar278 * (float)local_500._0_4_ +
                        (float)local_280._0_4_ * fVar247);
    fVar351 = fVar286 * ((float)local_200._4_4_ * fVar262 +
                        fVar196 * (float)local_580._4_4_ + fVar292 * (float)local_500._4_4_ +
                        (float)local_280._4_4_ * fVar248);
    auVar104._4_4_ = fVar351;
    auVar104._0_4_ = fVar346;
    fVar353 = fVar236 * (fStack_1f8 * fVar263 +
                        fVar214 * fStack_578 + fVar321 * fStack_4f8 + fStack_278 * fVar251);
    auVar104._8_4_ = fVar353;
    fVar355 = fVar256 * (fStack_1f4 * fVar265 +
                        fVar197 * fStack_574 + fVar234 * fStack_4f4 + fStack_274 * fVar253);
    auVar104._12_4_ = fVar355;
    fVar357 = fVar216 * (fStack_1f0 * fVar272 +
                        fVar215 * fStack_570 + fVar235 * fStack_4f0 + fStack_270 * fVar254);
    auVar104._16_4_ = fVar357;
    fVar359 = fVar286 * (fStack_1ec * fVar273 +
                        fVar198 * fStack_56c + fVar250 * fStack_4ec + fStack_26c * fVar259);
    auVar104._20_4_ = fVar359;
    fVar361 = fVar236 * (fStack_1e8 * fVar274 +
                        fVar289 * fStack_568 + fVar238 * fStack_4e8 + fStack_268 * fVar260);
    auVar104._24_4_ = fVar361;
    auVar104._28_4_ = fStack_224;
    fVar278 = fVar216 * ((float)local_220._0_4_ * fVar257 +
                        fVar247 * (float)local_4a0._0_4_ +
                        fVar199 * (float)local_5a0._0_4_ + fVar278 * (float)local_520._0_4_);
    fVar247 = fVar286 * ((float)local_220._4_4_ * fVar262 +
                        fVar248 * (float)local_4a0._4_4_ +
                        fVar196 * (float)local_5a0._4_4_ + fVar292 * (float)local_520._4_4_);
    auVar16._4_4_ = fVar247;
    auVar16._0_4_ = fVar278;
    fVar248 = fVar236 * (fStack_218 * fVar263 +
                        fVar251 * fStack_498 + fVar214 * fStack_598 + fVar321 * fStack_518);
    auVar16._8_4_ = fVar248;
    fVar257 = fVar256 * (fStack_214 * fVar265 +
                        fVar253 * fStack_494 + fVar197 * fStack_594 + fVar234 * fStack_514);
    auVar16._12_4_ = fVar257;
    fVar216 = fVar216 * (fStack_210 * fVar272 +
                        fVar254 * fStack_490 + fVar215 * fStack_590 + fVar235 * fStack_510);
    auVar16._16_4_ = fVar216;
    fVar286 = fVar286 * (fStack_20c * fVar273 +
                        fVar259 * fStack_48c + fVar198 * fStack_58c + fVar250 * fStack_50c);
    auVar16._20_4_ = fVar286;
    fVar236 = fVar236 * (fStack_208 * fVar274 +
                        fVar260 * fStack_488 + fVar289 * fStack_588 + fVar238 * fStack_508);
    auVar16._24_4_ = fVar236;
    auVar16._28_4_ = fVar256;
    auVar70._4_4_ = fVar288;
    auVar70._0_4_ = fVar280;
    auVar70._8_4_ = fVar291;
    auVar70._12_4_ = fVar294;
    auVar70._16_4_ = fVar296;
    auVar70._20_4_ = fVar298;
    auVar70._24_4_ = fVar300;
    auVar70._28_4_ = fVar302;
    auVar101 = vperm2f128_avx(auVar70,auVar70,1);
    auVar101 = vshufps_avx(auVar101,auVar70,0x30);
    local_ac0 = vshufps_avx(auVar70,auVar101,0x29);
    auVar101 = vperm2f128_avx(_local_d20,_local_d20,1);
    auVar101 = vshufps_avx(auVar101,_local_d20,0x30);
    auVar192 = vshufps_avx(_local_d20,auVar101,0x29);
    auVar19 = vsubps_avx(_local_b40,auVar16);
    auVar101 = vperm2f128_avx(auVar19,auVar19,1);
    auVar101 = vshufps_avx(auVar101,auVar19,0x30);
    auVar16 = vshufps_avx(auVar19,auVar101,0x29);
    local_5e0 = vsubps_avx(local_ac0,auVar70);
    local_2e0 = vsubps_avx(auVar192,_local_d20);
    fVar196 = local_5e0._0_4_;
    fVar289 = local_5e0._4_4_;
    auVar17._4_4_ = fVar351 * fVar289;
    auVar17._0_4_ = fVar346 * fVar196;
    fVar250 = local_5e0._8_4_;
    auVar17._8_4_ = fVar353 * fVar250;
    fVar260 = local_5e0._12_4_;
    auVar17._12_4_ = fVar355 * fVar260;
    fVar276 = local_5e0._16_4_;
    auVar17._16_4_ = fVar357 * fVar276;
    fVar299 = local_5e0._20_4_;
    auVar17._20_4_ = fVar359 * fVar299;
    fVar7 = local_5e0._24_4_;
    auVar17._24_4_ = fVar361 * fVar7;
    auVar17._28_4_ = auVar19._28_4_;
    fVar214 = local_2e0._0_4_;
    fVar292 = local_2e0._4_4_;
    auVar21._4_4_ = fVar327 * fVar292;
    auVar21._0_4_ = fVar322 * fVar214;
    fVar238 = local_2e0._8_4_;
    auVar21._8_4_ = fVar328 * fVar238;
    fVar262 = local_2e0._12_4_;
    auVar21._12_4_ = fVar329 * fVar262;
    fVar277 = local_2e0._16_4_;
    auVar21._16_4_ = fVar330 * fVar277;
    fVar301 = local_2e0._20_4_;
    auVar21._20_4_ = fVar331 * fVar301;
    fVar8 = local_2e0._24_4_;
    auVar21._24_4_ = fVar332 * fVar8;
    auVar21._28_4_ = auVar101._28_4_;
    auVar20 = vsubps_avx(auVar21,auVar17);
    auVar74._4_4_ = fStack_a3c;
    auVar74._0_4_ = local_a40;
    auVar74._8_4_ = fStack_a38;
    auVar74._12_4_ = fStack_a34;
    auVar74._16_4_ = fStack_a30;
    auVar74._20_4_ = fStack_a2c;
    auVar74._24_4_ = fStack_a28;
    auVar74._28_4_ = fStack_a24;
    auVar101 = vperm2f128_avx(auVar74,auVar74,1);
    auVar101 = vshufps_avx(auVar101,auVar74,0x30);
    auVar17 = vshufps_avx(auVar74,auVar101,0x29);
    local_600 = vsubps_avx(auVar17,auVar74);
    auVar22._4_4_ = fVar340 * fVar292;
    auVar22._0_4_ = fVar334 * fVar214;
    auVar22._8_4_ = fVar341 * fVar238;
    auVar22._12_4_ = fVar342 * fVar262;
    auVar22._16_4_ = fVar343 * fVar277;
    auVar22._20_4_ = fVar344 * fVar301;
    auVar22._24_4_ = fVar345 * fVar8;
    auVar22._28_4_ = auVar101._28_4_;
    fVar197 = local_600._0_4_;
    fVar321 = local_600._4_4_;
    auVar23._4_4_ = fVar351 * fVar321;
    auVar23._0_4_ = fVar346 * fVar197;
    fVar251 = local_600._8_4_;
    auVar23._8_4_ = fVar353 * fVar251;
    fVar263 = local_600._12_4_;
    auVar23._12_4_ = fVar355 * fVar263;
    fVar279 = local_600._16_4_;
    auVar23._16_4_ = fVar357 * fVar279;
    fVar310 = local_600._20_4_;
    auVar23._20_4_ = fVar359 * fVar310;
    fVar9 = local_600._24_4_;
    auVar23._24_4_ = fVar361 * fVar9;
    auVar23._28_4_ = fVar311;
    auVar21 = vsubps_avx(auVar23,auVar22);
    auVar364._4_4_ = fVar327 * fVar321;
    auVar364._0_4_ = fVar322 * fVar197;
    auVar364._8_4_ = fVar328 * fVar251;
    auVar364._12_4_ = fVar329 * fVar263;
    auVar364._16_4_ = fVar330 * fVar279;
    auVar364._20_4_ = fVar331 * fVar310;
    auVar364._24_4_ = fVar332 * fVar9;
    auVar364._28_4_ = fVar311;
    auVar18._4_4_ = fVar340 * fVar289;
    auVar18._0_4_ = fVar334 * fVar196;
    auVar18._8_4_ = fVar341 * fVar250;
    auVar18._12_4_ = fVar342 * fVar260;
    auVar18._16_4_ = fVar343 * fVar276;
    auVar18._20_4_ = fVar344 * fVar299;
    auVar18._24_4_ = fVar345 * fVar7;
    auVar18._28_4_ = uStack_1e4;
    auVar22 = vsubps_avx(auVar18,auVar364);
    fVar199 = auVar22._28_4_;
    auVar168._0_4_ = fVar197 * fVar197 + fVar196 * fVar196 + fVar214 * fVar214;
    auVar168._4_4_ = fVar321 * fVar321 + fVar289 * fVar289 + fVar292 * fVar292;
    auVar168._8_4_ = fVar251 * fVar251 + fVar250 * fVar250 + fVar238 * fVar238;
    auVar168._12_4_ = fVar263 * fVar263 + fVar260 * fVar260 + fVar262 * fVar262;
    auVar168._16_4_ = fVar279 * fVar279 + fVar276 * fVar276 + fVar277 * fVar277;
    auVar168._20_4_ = fVar310 * fVar310 + fVar299 * fVar299 + fVar301 * fVar301;
    auVar168._24_4_ = fVar9 * fVar9 + fVar7 * fVar7 + fVar8 * fVar8;
    auVar168._28_4_ = fVar199 + fVar199 + auVar20._28_4_;
    auVar101 = vrcpps_avx(auVar168);
    fVar259 = auVar101._0_4_;
    fVar273 = auVar101._4_4_;
    auVar26._4_4_ = fVar273 * auVar168._4_4_;
    auVar26._0_4_ = fVar259 * auVar168._0_4_;
    fVar274 = auVar101._8_4_;
    auVar26._8_4_ = fVar274 * auVar168._8_4_;
    fVar275 = auVar101._12_4_;
    auVar26._12_4_ = fVar275 * auVar168._12_4_;
    fVar293 = auVar101._16_4_;
    auVar26._16_4_ = fVar293 * auVar168._16_4_;
    fVar295 = auVar101._20_4_;
    auVar26._20_4_ = fVar295 * auVar168._20_4_;
    fVar297 = auVar101._24_4_;
    auVar26._24_4_ = fVar297 * auVar168._24_4_;
    auVar26._28_4_ = uStack_1e4;
    auVar137._8_4_ = 0x3f800000;
    auVar137._0_8_ = 0x3f8000003f800000;
    auVar137._12_4_ = 0x3f800000;
    auVar137._16_4_ = 0x3f800000;
    auVar137._20_4_ = 0x3f800000;
    auVar137._24_4_ = 0x3f800000;
    auVar137._28_4_ = 0x3f800000;
    auVar23 = vsubps_avx(auVar137,auVar26);
    fVar259 = fVar259 + fVar259 * auVar23._0_4_;
    fVar273 = fVar273 + fVar273 * auVar23._4_4_;
    fVar274 = fVar274 + fVar274 * auVar23._8_4_;
    fVar275 = fVar275 + fVar275 * auVar23._12_4_;
    fVar293 = fVar293 + fVar293 * auVar23._16_4_;
    fVar295 = fVar295 + fVar295 * auVar23._20_4_;
    fVar297 = fVar297 + fVar297 * auVar23._24_4_;
    auVar19 = vperm2f128_avx(auVar24,auVar24,1);
    auVar19 = vshufps_avx(auVar19,auVar24,0x30);
    local_aa0 = vshufps_avx(auVar24,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar104,auVar104,1);
    auVar19 = vshufps_avx(auVar19,auVar104,0x30);
    local_960 = vshufps_avx(auVar104,auVar19,0x29);
    fVar347 = local_960._0_4_;
    fVar352 = local_960._4_4_;
    auVar27._4_4_ = fVar352 * fVar289;
    auVar27._0_4_ = fVar347 * fVar196;
    fVar354 = local_960._8_4_;
    auVar27._8_4_ = fVar354 * fVar250;
    fVar356 = local_960._12_4_;
    auVar27._12_4_ = fVar356 * fVar260;
    fVar358 = local_960._16_4_;
    auVar27._16_4_ = fVar358 * fVar276;
    fVar360 = local_960._20_4_;
    auVar27._20_4_ = fVar360 * fVar299;
    fVar362 = local_960._24_4_;
    auVar27._24_4_ = fVar362 * fVar7;
    auVar27._28_4_ = auVar19._28_4_;
    fVar215 = local_aa0._0_4_;
    fVar234 = local_aa0._4_4_;
    auVar28._4_4_ = fVar292 * fVar234;
    auVar28._0_4_ = fVar214 * fVar215;
    fVar253 = local_aa0._8_4_;
    auVar28._8_4_ = fVar238 * fVar253;
    fVar265 = local_aa0._12_4_;
    auVar28._12_4_ = fVar262 * fVar265;
    fVar287 = local_aa0._16_4_;
    auVar28._16_4_ = fVar277 * fVar287;
    fVar311 = local_aa0._20_4_;
    auVar28._20_4_ = fVar301 * fVar311;
    fVar10 = local_aa0._24_4_;
    auVar28._24_4_ = fVar8 * fVar10;
    auVar28._28_4_ = fStack_204;
    auVar24 = vsubps_avx(auVar28,auVar27);
    auVar19 = vperm2f128_avx(auVar25,auVar25,1);
    auVar19 = vshufps_avx(auVar19,auVar25,0x30);
    local_940 = vshufps_avx(auVar25,auVar19,0x29);
    fVar198 = local_940._0_4_;
    fVar235 = local_940._4_4_;
    auVar29._4_4_ = fVar292 * fVar235;
    auVar29._0_4_ = fVar214 * fVar198;
    fVar254 = local_940._8_4_;
    auVar29._8_4_ = fVar238 * fVar254;
    fVar272 = local_940._12_4_;
    auVar29._12_4_ = fVar262 * fVar272;
    fVar290 = local_940._16_4_;
    auVar29._16_4_ = fVar277 * fVar290;
    fVar333 = local_940._20_4_;
    auVar29._20_4_ = fVar301 * fVar333;
    fVar11 = local_940._24_4_;
    auVar29._24_4_ = fVar8 * fVar11;
    auVar29._28_4_ = auVar19._28_4_;
    auVar30._4_4_ = fVar352 * fVar321;
    auVar30._0_4_ = fVar347 * fVar197;
    auVar30._8_4_ = fVar354 * fVar251;
    auVar30._12_4_ = fVar356 * fVar263;
    auVar30._16_4_ = fVar358 * fVar279;
    auVar30._20_4_ = fVar360 * fVar310;
    auVar30._24_4_ = fVar362 * fVar9;
    auVar30._28_4_ = uStack_1c4;
    auVar19 = vsubps_avx(auVar30,auVar29);
    auVar31._4_4_ = fVar321 * fVar234;
    auVar31._0_4_ = fVar197 * fVar215;
    auVar31._8_4_ = fVar251 * fVar253;
    auVar31._12_4_ = fVar263 * fVar265;
    auVar31._16_4_ = fVar279 * fVar287;
    auVar31._20_4_ = fVar310 * fVar311;
    auVar31._24_4_ = fVar9 * fVar10;
    auVar31._28_4_ = uStack_1c4;
    auVar33._4_4_ = fVar235 * fVar289;
    auVar33._0_4_ = fVar198 * fVar196;
    auVar33._8_4_ = fVar254 * fVar250;
    auVar33._12_4_ = fVar272 * fVar260;
    auVar33._16_4_ = fVar290 * fVar276;
    auVar33._20_4_ = fVar333 * fVar299;
    fVar32 = local_960._28_4_;
    auVar33._24_4_ = fVar11 * fVar7;
    auVar33._28_4_ = fVar32;
    auVar104 = vsubps_avx(auVar33,auVar31);
    auVar34._4_4_ =
         fVar273 * (auVar20._4_4_ * auVar20._4_4_ +
                   auVar22._4_4_ * auVar22._4_4_ + auVar21._4_4_ * auVar21._4_4_);
    auVar34._0_4_ =
         fVar259 * (auVar20._0_4_ * auVar20._0_4_ +
                   auVar22._0_4_ * auVar22._0_4_ + auVar21._0_4_ * auVar21._0_4_);
    auVar34._8_4_ =
         fVar274 * (auVar20._8_4_ * auVar20._8_4_ +
                   auVar22._8_4_ * auVar22._8_4_ + auVar21._8_4_ * auVar21._8_4_);
    auVar34._12_4_ =
         fVar275 * (auVar20._12_4_ * auVar20._12_4_ +
                   auVar22._12_4_ * auVar22._12_4_ + auVar21._12_4_ * auVar21._12_4_);
    auVar34._16_4_ =
         fVar293 * (auVar20._16_4_ * auVar20._16_4_ +
                   auVar22._16_4_ * auVar22._16_4_ + auVar21._16_4_ * auVar21._16_4_);
    auVar34._20_4_ =
         fVar295 * (auVar20._20_4_ * auVar20._20_4_ +
                   auVar22._20_4_ * auVar22._20_4_ + auVar21._20_4_ * auVar21._20_4_);
    auVar34._24_4_ =
         fVar297 * (auVar20._24_4_ * auVar20._24_4_ +
                   auVar22._24_4_ * auVar22._24_4_ + auVar21._24_4_ * auVar21._24_4_);
    auVar34._28_4_ = auVar20._28_4_ + fVar199 + auVar21._28_4_;
    auVar35._4_4_ =
         (auVar24._4_4_ * auVar24._4_4_ +
         auVar19._4_4_ * auVar19._4_4_ + auVar104._4_4_ * auVar104._4_4_) * fVar273;
    auVar35._0_4_ =
         (auVar24._0_4_ * auVar24._0_4_ +
         auVar19._0_4_ * auVar19._0_4_ + auVar104._0_4_ * auVar104._0_4_) * fVar259;
    auVar35._8_4_ =
         (auVar24._8_4_ * auVar24._8_4_ +
         auVar19._8_4_ * auVar19._8_4_ + auVar104._8_4_ * auVar104._8_4_) * fVar274;
    auVar35._12_4_ =
         (auVar24._12_4_ * auVar24._12_4_ +
         auVar19._12_4_ * auVar19._12_4_ + auVar104._12_4_ * auVar104._12_4_) * fVar275;
    auVar35._16_4_ =
         (auVar24._16_4_ * auVar24._16_4_ +
         auVar19._16_4_ * auVar19._16_4_ + auVar104._16_4_ * auVar104._16_4_) * fVar293;
    auVar35._20_4_ =
         (auVar24._20_4_ * auVar24._20_4_ +
         auVar19._20_4_ * auVar19._20_4_ + auVar104._20_4_ * auVar104._20_4_) * fVar295;
    auVar35._24_4_ =
         (auVar24._24_4_ * auVar24._24_4_ +
         auVar19._24_4_ * auVar19._24_4_ + auVar104._24_4_ * auVar104._24_4_) * fVar297;
    auVar35._28_4_ = auVar101._28_4_ + auVar23._28_4_;
    auVar101 = vmaxps_avx(auVar34,auVar35);
    auVar19 = vperm2f128_avx(_local_b40,_local_b40,1);
    auVar19 = vshufps_avx(auVar19,_local_b40,0x30);
    auVar21 = vshufps_avx(_local_b40,auVar19,0x29);
    auVar102._0_4_ = (float)local_b40._0_4_ + fVar278;
    auVar102._4_4_ = (float)local_b40._4_4_ + fVar247;
    auVar102._8_4_ = fStack_b38 + fVar248;
    auVar102._12_4_ = fStack_b34 + fVar257;
    auVar102._16_4_ = fStack_b30 + fVar216;
    auVar102._20_4_ = fStack_b2c + fVar286;
    auVar102._24_4_ = fStack_b28 + fVar236;
    auVar102._28_4_ = fStack_b24 + fVar256;
    auVar19 = vmaxps_avx(_local_b40,auVar102);
    auVar20 = vmaxps_avx(auVar16,auVar21);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar20 = vrsqrtps_avx(auVar168);
    fVar199 = auVar20._0_4_;
    fVar216 = auVar20._4_4_;
    fVar278 = auVar20._8_4_;
    fVar286 = auVar20._12_4_;
    fVar247 = auVar20._16_4_;
    fVar236 = auVar20._20_4_;
    fVar248 = auVar20._24_4_;
    auVar36._4_4_ = fVar216 * fVar216 * fVar216 * auVar168._4_4_ * 0.5;
    auVar36._0_4_ = fVar199 * fVar199 * fVar199 * auVar168._0_4_ * 0.5;
    auVar36._8_4_ = fVar278 * fVar278 * fVar278 * auVar168._8_4_ * 0.5;
    auVar36._12_4_ = fVar286 * fVar286 * fVar286 * auVar168._12_4_ * 0.5;
    auVar36._16_4_ = fVar247 * fVar247 * fVar247 * auVar168._16_4_ * 0.5;
    auVar36._20_4_ = fVar236 * fVar236 * fVar236 * auVar168._20_4_ * 0.5;
    auVar36._24_4_ = fVar248 * fVar248 * fVar248 * auVar168._24_4_ * 0.5;
    auVar36._28_4_ = auVar168._28_4_;
    auVar37._4_4_ = fVar216 * 1.5;
    auVar37._0_4_ = fVar199 * 1.5;
    auVar37._8_4_ = fVar278 * 1.5;
    auVar37._12_4_ = fVar286 * 1.5;
    auVar37._16_4_ = fVar247 * 1.5;
    auVar37._20_4_ = fVar236 * 1.5;
    auVar37._24_4_ = fVar248 * 1.5;
    auVar37._28_4_ = auVar20._28_4_;
    local_680 = vsubps_avx(auVar37,auVar36);
    auVar71._4_4_ = fVar288;
    auVar71._0_4_ = fVar280;
    auVar71._8_4_ = fVar291;
    auVar71._12_4_ = fVar294;
    auVar71._16_4_ = fVar296;
    auVar71._20_4_ = fVar298;
    auVar71._24_4_ = fVar300;
    auVar71._28_4_ = fVar302;
    local_980 = vsubps_avx(ZEXT832(0) << 0x20,auVar71);
    auVar22 = vsubps_avx(ZEXT832(0) << 0x20,_local_d20);
    auVar314 = ZEXT3264(auVar22);
    fVar312 = auVar22._0_4_;
    fVar315 = auVar22._4_4_;
    fVar316 = auVar22._8_4_;
    fVar317 = auVar22._12_4_;
    fVar318 = auVar22._16_4_;
    fVar319 = auVar22._20_4_;
    fVar320 = auVar22._24_4_;
    fVar216 = local_980._0_4_;
    fVar247 = local_980._4_4_;
    fVar256 = local_980._8_4_;
    fVar273 = local_980._12_4_;
    fVar293 = local_980._16_4_;
    fVar367 = local_980._20_4_;
    fVar12 = local_980._24_4_;
    auVar364 = ZEXT832(0) << 0x20;
    auVar22 = vsubps_avx(auVar364,auVar74);
    fVar278 = auVar22._0_4_;
    fVar236 = auVar22._4_4_;
    fVar257 = auVar22._8_4_;
    fVar274 = auVar22._12_4_;
    fVar295 = auVar22._16_4_;
    fVar368 = auVar22._20_4_;
    fVar13 = auVar22._24_4_;
    auVar304._0_4_ =
         (float)local_8e0._0_4_ * fVar278 +
         (float)local_900._0_4_ * fVar216 + fVar312 * (float)local_920._0_4_;
    auVar304._4_4_ =
         (float)local_8e0._4_4_ * fVar236 +
         (float)local_900._4_4_ * fVar247 + fVar315 * (float)local_920._4_4_;
    auVar304._8_4_ = fStack_8d8 * fVar257 + fStack_8f8 * fVar256 + fVar316 * fStack_918;
    auVar304._12_4_ = fStack_8d4 * fVar274 + fStack_8f4 * fVar273 + fVar317 * fStack_914;
    auVar304._16_4_ = fStack_8d0 * fVar295 + fStack_8f0 * fVar293 + fVar318 * fStack_910;
    auVar304._20_4_ = fStack_8cc * fVar368 + fStack_8ec * fVar367 + fVar319 * fStack_90c;
    auVar304._24_4_ = fStack_8c8 * fVar13 + fStack_8e8 * fVar12 + fVar320 * fStack_908;
    auVar304._28_4_ = auVar104._28_4_ + auVar20._28_4_ + auVar168._28_4_;
    auVar337._0_4_ = fVar278 * fVar278 + fVar216 * fVar216 + fVar312 * fVar312;
    auVar337._4_4_ = fVar236 * fVar236 + fVar247 * fVar247 + fVar315 * fVar315;
    auVar337._8_4_ = fVar257 * fVar257 + fVar256 * fVar256 + fVar316 * fVar316;
    auVar337._12_4_ = fVar274 * fVar274 + fVar273 * fVar273 + fVar317 * fVar317;
    auVar337._16_4_ = fVar295 * fVar295 + fVar293 * fVar293 + fVar318 * fVar318;
    auVar337._20_4_ = fVar368 * fVar368 + fVar367 * fVar367 + fVar319 * fVar319;
    auVar337._24_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar320 * fVar320;
    auVar337._28_4_ = fVar32 + fVar32 + auVar104._28_4_;
    fVar286 = local_680._0_4_;
    fVar248 = local_680._4_4_;
    fVar259 = local_680._8_4_;
    fVar275 = local_680._12_4_;
    fVar297 = local_680._16_4_;
    fVar237 = local_680._20_4_;
    fVar239 = local_680._24_4_;
    local_6a0 = (float)local_8e0._0_4_ * fVar197 * fVar286 +
                fVar196 * fVar286 * (float)local_900._0_4_ +
                fVar214 * fVar286 * (float)local_920._0_4_;
    fStack_69c = (float)local_8e0._4_4_ * fVar321 * fVar248 +
                 fVar289 * fVar248 * (float)local_900._4_4_ +
                 fVar292 * fVar248 * (float)local_920._4_4_;
    fStack_698 = fStack_8d8 * fVar251 * fVar259 +
                 fVar250 * fVar259 * fStack_8f8 + fVar238 * fVar259 * fStack_918;
    fStack_694 = fStack_8d4 * fVar263 * fVar275 +
                 fVar260 * fVar275 * fStack_8f4 + fVar262 * fVar275 * fStack_914;
    fStack_690 = fStack_8d0 * fVar279 * fVar297 +
                 fVar276 * fVar297 * fStack_8f0 + fVar277 * fVar297 * fStack_910;
    fStack_68c = fStack_8cc * fVar310 * fVar237 +
                 fVar299 * fVar237 * fStack_8ec + fVar301 * fVar237 * fStack_90c;
    fStack_688 = fStack_8c8 * fVar9 * fVar239 +
                 fVar7 * fVar239 * fStack_8e8 + fVar8 * fVar239 * fStack_908;
    fStack_684 = fStack_8c4 + fStack_8e4 + fStack_904;
    fVar199 = fStack_8c4 + fStack_8e4 + fStack_904;
    local_6c0._0_4_ =
         fVar278 * fVar197 * fVar286 + fVar196 * fVar286 * fVar216 + fVar312 * fVar214 * fVar286;
    local_6c0._4_4_ =
         fVar236 * fVar321 * fVar248 + fVar289 * fVar248 * fVar247 + fVar315 * fVar292 * fVar248;
    local_6c0._8_4_ =
         fVar257 * fVar251 * fVar259 + fVar250 * fVar259 * fVar256 + fVar316 * fVar238 * fVar259;
    local_6c0._12_4_ =
         fVar274 * fVar263 * fVar275 + fVar260 * fVar275 * fVar273 + fVar317 * fVar262 * fVar275;
    local_6c0._16_4_ =
         fVar295 * fVar279 * fVar297 + fVar276 * fVar297 * fVar293 + fVar318 * fVar277 * fVar297;
    local_6c0._20_4_ =
         fVar368 * fVar310 * fVar237 + fVar299 * fVar237 * fVar367 + fVar319 * fVar301 * fVar237;
    local_6c0._24_4_ =
         fVar13 * fVar9 * fVar239 + fVar7 * fVar239 * fVar12 + fVar320 * fVar8 * fVar239;
    local_6c0._28_4_ = fStack_8e4 + fVar199;
    auVar38._4_4_ = fStack_69c * local_6c0._4_4_;
    auVar38._0_4_ = local_6a0 * local_6c0._0_4_;
    auVar38._8_4_ = fStack_698 * local_6c0._8_4_;
    auVar38._12_4_ = fStack_694 * local_6c0._12_4_;
    auVar38._16_4_ = fStack_690 * local_6c0._16_4_;
    auVar38._20_4_ = fStack_68c * local_6c0._20_4_;
    auVar38._24_4_ = fStack_688 * local_6c0._24_4_;
    auVar38._28_4_ = fVar199;
    auVar20 = vsubps_avx(auVar304,auVar38);
    auVar39._4_4_ = local_6c0._4_4_ * local_6c0._4_4_;
    auVar39._0_4_ = local_6c0._0_4_ * local_6c0._0_4_;
    auVar39._8_4_ = local_6c0._8_4_ * local_6c0._8_4_;
    auVar39._12_4_ = local_6c0._12_4_ * local_6c0._12_4_;
    auVar39._16_4_ = local_6c0._16_4_ * local_6c0._16_4_;
    auVar39._20_4_ = local_6c0._20_4_ * local_6c0._20_4_;
    auVar39._24_4_ = local_6c0._24_4_ * local_6c0._24_4_;
    auVar39._28_4_ = fStack_8e4;
    auVar23 = vsubps_avx(auVar337,auVar39);
    local_2c0 = vsqrtps_avx(auVar101);
    local_ce0._0_4_ = auVar19._0_4_;
    local_ce0._4_4_ = auVar19._4_4_;
    fStack_cd8 = auVar19._8_4_;
    fStack_cd4 = auVar19._12_4_;
    fStack_cd0 = auVar19._16_4_;
    fStack_ccc = auVar19._20_4_;
    fStack_cc8 = auVar19._24_4_;
    fStack_cc4 = auVar19._28_4_;
    fVar199 = (local_2c0._0_4_ + (float)local_ce0._0_4_) * 1.0000002;
    fVar114 = (local_2c0._4_4_ + (float)local_ce0._4_4_) * 1.0000002;
    fVar115 = (local_2c0._8_4_ + fStack_cd8) * 1.0000002;
    fVar116 = (local_2c0._12_4_ + fStack_cd4) * 1.0000002;
    fVar118 = (local_2c0._16_4_ + fStack_cd0) * 1.0000002;
    fVar120 = (local_2c0._20_4_ + fStack_ccc) * 1.0000002;
    fVar122 = (local_2c0._24_4_ + fStack_cc8) * 1.0000002;
    auVar40._4_4_ = fVar114 * fVar114;
    auVar40._0_4_ = fVar199 * fVar199;
    auVar40._8_4_ = fVar115 * fVar115;
    auVar40._12_4_ = fVar116 * fVar116;
    auVar40._16_4_ = fVar118 * fVar118;
    auVar40._20_4_ = fVar120 * fVar120;
    auVar40._24_4_ = fVar122 * fVar122;
    auVar40._28_4_ = local_2c0._28_4_ + fStack_cc4;
    local_3c0._0_4_ = auVar20._0_4_ + auVar20._0_4_;
    local_3c0._4_4_ = auVar20._4_4_ + auVar20._4_4_;
    local_3c0._8_4_ = auVar20._8_4_ + auVar20._8_4_;
    local_3c0._12_4_ = auVar20._12_4_ + auVar20._12_4_;
    local_3c0._16_4_ = auVar20._16_4_ + auVar20._16_4_;
    local_3c0._20_4_ = auVar20._20_4_ + auVar20._20_4_;
    local_3c0._24_4_ = auVar20._24_4_ + auVar20._24_4_;
    fVar199 = auVar20._28_4_;
    local_3c0._28_4_ = fVar199 + fVar199;
    auVar19 = vsubps_avx(auVar23,auVar40);
    auVar41._4_4_ = fStack_69c * fStack_69c;
    auVar41._0_4_ = local_6a0 * local_6a0;
    auVar41._8_4_ = fStack_698 * fStack_698;
    auVar41._12_4_ = fStack_694 * fStack_694;
    auVar41._16_4_ = fStack_690 * fStack_690;
    auVar41._20_4_ = fStack_68c * fStack_68c;
    auVar41._24_4_ = fStack_688 * fStack_688;
    auVar41._28_4_ = fVar199;
    auVar20 = vsubps_avx(local_2a0,auVar41);
    auVar42._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    auVar42._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    auVar42._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar42._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar42._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar42._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar42._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar42._28_4_ = 0x3f800002;
    fVar199 = auVar20._0_4_;
    fVar114 = auVar20._4_4_;
    fVar115 = auVar20._8_4_;
    fVar116 = auVar20._12_4_;
    fVar118 = auVar20._16_4_;
    fStack_890 = fVar118 * 4.0;
    fVar120 = auVar20._20_4_;
    fStack_88c = fVar120 * 4.0;
    fVar122 = auVar20._24_4_;
    fStack_888 = fVar122 * 4.0;
    uStack_884 = 0x40800000;
    auVar43._4_4_ = auVar19._4_4_ * fVar114 * 4.0;
    auVar43._0_4_ = auVar19._0_4_ * fVar199 * 4.0;
    auVar43._8_4_ = auVar19._8_4_ * fVar115 * 4.0;
    auVar43._12_4_ = auVar19._12_4_ * fVar116 * 4.0;
    auVar43._16_4_ = auVar19._16_4_ * fStack_890;
    auVar43._20_4_ = auVar19._20_4_ * fStack_88c;
    auVar43._24_4_ = auVar19._24_4_ * fStack_888;
    auVar43._28_4_ = 0x40800000;
    auVar24 = vsubps_avx(auVar42,auVar43);
    auVar101 = vcmpps_avx(auVar24,auVar364,5);
    auVar207._8_4_ = 0x7fffffff;
    auVar207._0_8_ = 0x7fffffff7fffffff;
    auVar207._12_4_ = 0x7fffffff;
    auVar207._16_4_ = 0x7fffffff;
    auVar207._20_4_ = 0x7fffffff;
    auVar207._24_4_ = 0x7fffffff;
    auVar207._28_4_ = 0x7fffffff;
    local_300 = vandps_avx(auVar41,auVar207);
    local_320._0_4_ = fVar199 + fVar199;
    local_320._4_4_ = fVar114 + fVar114;
    local_320._8_4_ = fVar115 + fVar115;
    local_320._12_4_ = fVar116 + fVar116;
    local_320._16_4_ = fVar118 + fVar118;
    local_320._20_4_ = fVar120 + fVar120;
    local_320._24_4_ = fVar122 + fVar122;
    local_320._28_4_ = auVar20._28_4_ + auVar20._28_4_;
    local_3a0 = vandps_avx(auVar20,auVar207);
    uVar81 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_a60._0_8_ = uVar81 ^ 0x8000000080000000;
    local_a60._8_4_ = -local_3c0._8_4_;
    local_a60._12_4_ = -local_3c0._12_4_;
    local_a60._16_4_ = -local_3c0._16_4_;
    local_a60._20_4_ = -local_3c0._20_4_;
    local_a60._24_4_ = -local_3c0._24_4_;
    local_a60._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar101 >> 0x7f,0) == '\0') &&
          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar101 >> 0xbf,0) == '\0') &&
        (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar101[0x1f])
    {
      auVar138._8_4_ = 0x7f800000;
      auVar138._0_8_ = 0x7f8000007f800000;
      auVar138._12_4_ = 0x7f800000;
      auVar138._16_4_ = 0x7f800000;
      auVar138._20_4_ = 0x7f800000;
      auVar138._24_4_ = 0x7f800000;
      auVar138._28_4_ = 0x7f800000;
      auVar103._8_4_ = 0xff800000;
      auVar103._0_8_ = 0xff800000ff800000;
      auVar103._12_4_ = 0xff800000;
      auVar103._16_4_ = 0xff800000;
      auVar103._20_4_ = 0xff800000;
      auVar103._24_4_ = 0xff800000;
      auVar103._28_4_ = 0xff800000;
      local_9c0 = local_2a0;
    }
    else {
      auVar18 = vsqrtps_avx(auVar24);
      auVar104 = vrcpps_avx(local_320);
      auVar20 = vcmpps_avx(auVar24,auVar364,5);
      fVar118 = auVar104._0_4_;
      fVar120 = auVar104._4_4_;
      auVar44._4_4_ = local_320._4_4_ * fVar120;
      auVar44._0_4_ = local_320._0_4_ * fVar118;
      fVar122 = auVar104._8_4_;
      auVar44._8_4_ = local_320._8_4_ * fVar122;
      fVar117 = auVar104._12_4_;
      auVar44._12_4_ = local_320._12_4_ * fVar117;
      fVar119 = auVar104._16_4_;
      auVar44._16_4_ = local_320._16_4_ * fVar119;
      fVar121 = auVar104._20_4_;
      auVar44._20_4_ = local_320._20_4_ * fVar121;
      fVar123 = auVar104._24_4_;
      auVar44._24_4_ = local_320._24_4_ * fVar123;
      auVar44._28_4_ = auVar24._28_4_;
      auVar208._8_4_ = 0x3f800000;
      auVar208._0_8_ = 0x3f8000003f800000;
      auVar208._12_4_ = 0x3f800000;
      auVar208._16_4_ = 0x3f800000;
      auVar208._20_4_ = 0x3f800000;
      auVar208._24_4_ = 0x3f800000;
      auVar208._28_4_ = 0x3f800000;
      auVar24 = vsubps_avx(auVar208,auVar44);
      fVar118 = fVar118 + fVar118 * auVar24._0_4_;
      fVar120 = fVar120 + fVar120 * auVar24._4_4_;
      fVar122 = fVar122 + fVar122 * auVar24._8_4_;
      fVar117 = fVar117 + fVar117 * auVar24._12_4_;
      fVar119 = fVar119 + fVar119 * auVar24._16_4_;
      fVar121 = fVar121 + fVar121 * auVar24._20_4_;
      fVar123 = fVar123 + fVar123 * auVar24._24_4_;
      auVar364 = vsubps_avx(local_a60,auVar18);
      fVar240 = auVar364._0_4_ * fVar118;
      fVar249 = auVar364._4_4_ * fVar120;
      auVar45._4_4_ = fVar249;
      auVar45._0_4_ = fVar240;
      fVar252 = auVar364._8_4_ * fVar122;
      auVar45._8_4_ = fVar252;
      fVar255 = auVar364._12_4_ * fVar117;
      auVar45._12_4_ = fVar255;
      fVar258 = auVar364._16_4_ * fVar119;
      auVar45._16_4_ = fVar258;
      fVar261 = auVar364._20_4_ * fVar121;
      auVar45._20_4_ = fVar261;
      fVar264 = auVar364._24_4_ * fVar123;
      auVar45._24_4_ = fVar264;
      auVar45._28_4_ = auVar364._28_4_;
      auVar364 = vsubps_avx(auVar18,local_3c0);
      fVar118 = auVar364._0_4_ * fVar118;
      fVar120 = auVar364._4_4_ * fVar120;
      auVar46._4_4_ = fVar120;
      auVar46._0_4_ = fVar118;
      fVar122 = auVar364._8_4_ * fVar122;
      auVar46._8_4_ = fVar122;
      fVar117 = auVar364._12_4_ * fVar117;
      auVar46._12_4_ = fVar117;
      fVar119 = auVar364._16_4_ * fVar119;
      auVar46._16_4_ = fVar119;
      fVar121 = auVar364._20_4_ * fVar121;
      auVar46._20_4_ = fVar121;
      fVar123 = auVar364._24_4_ * fVar123;
      auVar46._24_4_ = fVar123;
      auVar46._28_4_ = auVar104._28_4_ + auVar24._28_4_;
      local_360 = fVar286 * (local_6c0._0_4_ + local_6a0 * fVar240);
      fStack_35c = fVar248 * (local_6c0._4_4_ + fStack_69c * fVar249);
      fStack_358 = fVar259 * (local_6c0._8_4_ + fStack_698 * fVar252);
      fStack_354 = fVar275 * (local_6c0._12_4_ + fStack_694 * fVar255);
      fStack_350 = fVar297 * (local_6c0._16_4_ + fStack_690 * fVar258);
      fStack_34c = fVar237 * (local_6c0._20_4_ + fStack_68c * fVar261);
      fStack_348 = fVar239 * (local_6c0._24_4_ + fStack_688 * fVar264);
      fStack_344 = local_320._28_4_;
      local_380 = fVar286 * (local_6c0._0_4_ + local_6a0 * fVar118);
      fStack_37c = fVar248 * (local_6c0._4_4_ + fStack_69c * fVar120);
      fStack_378 = fVar259 * (local_6c0._8_4_ + fStack_698 * fVar122);
      fStack_374 = fVar275 * (local_6c0._12_4_ + fStack_694 * fVar117);
      fStack_370 = fVar297 * (local_6c0._16_4_ + fStack_690 * fVar119);
      fStack_36c = fVar237 * (local_6c0._20_4_ + fStack_68c * fVar121);
      fStack_368 = fVar239 * (local_6c0._24_4_ + fStack_688 * fVar123);
      fStack_364 = local_320._28_4_;
      auVar226._8_4_ = 0x7f800000;
      auVar226._0_8_ = 0x7f8000007f800000;
      auVar226._12_4_ = 0x7f800000;
      auVar226._16_4_ = 0x7f800000;
      auVar226._20_4_ = 0x7f800000;
      auVar226._24_4_ = 0x7f800000;
      auVar226._28_4_ = 0x7f800000;
      auVar138 = vblendvps_avx(auVar226,auVar45,auVar20);
      auVar227._8_4_ = 0xff800000;
      auVar227._0_8_ = 0xff800000ff800000;
      auVar227._12_4_ = 0xff800000;
      auVar227._16_4_ = 0xff800000;
      auVar227._20_4_ = 0xff800000;
      auVar227._24_4_ = 0xff800000;
      auVar227._28_4_ = 0xff800000;
      auVar103 = vblendvps_avx(auVar227,auVar46,auVar20);
      auVar24 = vmaxps_avx(local_620,local_300);
      auVar47._4_4_ = auVar24._4_4_ * 1.9073486e-06;
      auVar47._0_4_ = auVar24._0_4_ * 1.9073486e-06;
      auVar47._8_4_ = auVar24._8_4_ * 1.9073486e-06;
      auVar47._12_4_ = auVar24._12_4_ * 1.9073486e-06;
      auVar47._16_4_ = auVar24._16_4_ * 1.9073486e-06;
      auVar47._20_4_ = auVar24._20_4_ * 1.9073486e-06;
      auVar47._24_4_ = auVar24._24_4_ * 1.9073486e-06;
      auVar47._28_4_ = auVar24._28_4_;
      auVar24 = vcmpps_avx(local_3a0,auVar47,1);
      auVar104 = auVar20 & auVar24;
      local_9c0 = local_a60;
      if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0x7f,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar104 >> 0xbf,0) != '\0') ||
          (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar104[0x1f] < '\0') {
        auVar101 = vandps_avx(auVar24,auVar20);
        auVar219 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
        auVar24 = vcmpps_avx(auVar19,_DAT_01f7b000,2);
        auVar308._8_4_ = 0xff800000;
        auVar308._0_8_ = 0xff800000ff800000;
        auVar308._12_4_ = 0xff800000;
        auVar308._16_4_ = 0xff800000;
        auVar308._20_4_ = 0xff800000;
        auVar308._24_4_ = 0xff800000;
        auVar308._28_4_ = 0xff800000;
        auVar269._8_4_ = 0x7f800000;
        auVar269._0_8_ = 0x7f8000007f800000;
        auVar269._12_4_ = 0x7f800000;
        auVar269._16_4_ = 0x7f800000;
        auVar269._20_4_ = 0x7f800000;
        auVar269._24_4_ = 0x7f800000;
        auVar269._28_4_ = 0x7f800000;
        auVar19 = vblendvps_avx(auVar269,auVar308,auVar24);
        auVar15 = vpmovsxwd_avx(auVar219);
        auVar219 = vpunpckhwd_avx(auVar219,auVar219);
        auVar233._16_16_ = auVar219;
        auVar233._0_16_ = auVar15;
        auVar138 = vblendvps_avx(auVar138,auVar19,auVar233);
        auVar270._8_4_ = 0xff800000;
        auVar270._0_8_ = 0xff800000ff800000;
        auVar270._12_4_ = 0xff800000;
        auVar270._16_4_ = 0xff800000;
        auVar270._20_4_ = 0xff800000;
        auVar270._24_4_ = 0xff800000;
        auVar270._28_4_ = 0xff800000;
        local_9c0 = vblendvps_avx(auVar270,auVar269,auVar24);
        auVar103 = vblendvps_avx(auVar103,local_9c0,auVar233);
        auVar194._0_8_ = auVar101._0_8_ ^ 0xffffffffffffffff;
        auVar194._8_4_ = auVar101._8_4_ ^ 0xffffffff;
        auVar194._12_4_ = auVar101._12_4_ ^ 0xffffffff;
        auVar194._16_4_ = auVar101._16_4_ ^ 0xffffffff;
        auVar194._20_4_ = auVar101._20_4_ ^ 0xffffffff;
        auVar194._24_4_ = auVar101._24_4_ ^ 0xffffffff;
        auVar194._28_4_ = auVar101._28_4_ ^ 0xffffffff;
        auVar101 = vorps_avx(auVar24,auVar194);
        auVar101 = vandps_avx(auVar20,auVar101);
      }
    }
    auVar305._8_4_ = 0x7fffffff;
    auVar305._0_8_ = 0x7fffffff7fffffff;
    auVar305._12_4_ = 0x7fffffff;
    auVar305._16_4_ = 0x7fffffff;
    auVar305._20_4_ = 0x7fffffff;
    auVar305._24_4_ = 0x7fffffff;
    auVar305._28_4_ = 0x7fffffff;
    auVar20 = local_5c0 & auVar101;
    auVar19 = _local_900;
    auVar338 = local_3a0;
    auVar323 = local_6c0;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar20 >> 0x7f,0) == '\0') &&
          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar20 >> 0xbf,0) == '\0') &&
        (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar20[0x1f]) {
LAB_007b79b0:
      auVar326 = ZEXT3264(auVar323);
      auVar271 = ZEXT3264(local_9c0);
      auVar339 = ZEXT3264(auVar338);
      auVar309 = ZEXT3264(auVar305);
      auVar246 = ZEXT3264(auVar19);
    }
    else {
      auVar309 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar219 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_9f0._0_4_));
      auVar219 = vshufps_avx(auVar219,auVar219,0);
      auVar228._16_16_ = auVar219;
      auVar228._0_16_ = auVar219;
      auVar24 = vminps_avx(auVar228,auVar103);
      fVar240 = fStack_8e4 + auVar219._12_4_;
      auVar139._0_4_ =
           (float)local_8e0._0_4_ * fVar334 +
           (float)local_900._0_4_ * fVar322 + (float)local_920._0_4_ * fVar346;
      auVar139._4_4_ =
           (float)local_8e0._4_4_ * fVar340 +
           (float)local_900._4_4_ * fVar327 + (float)local_920._4_4_ * fVar351;
      auVar139._8_4_ = fStack_8d8 * fVar341 + fStack_8f8 * fVar328 + fStack_918 * fVar353;
      auVar139._12_4_ = fStack_8d4 * fVar342 + fStack_8f4 * fVar329 + fStack_914 * fVar355;
      auVar139._16_4_ = fStack_8d0 * fVar343 + fStack_8f0 * fVar330 + fStack_910 * fVar357;
      auVar139._20_4_ = fStack_8cc * fVar344 + fStack_8ec * fVar331 + fStack_90c * fVar359;
      auVar139._24_4_ = fStack_8c8 * fVar345 + fStack_8e8 * fVar332 + fStack_908 * fVar361;
      auVar139._28_4_ = fStack_224 + fStack_204 + fStack_224;
      auVar19 = vrcpps_avx(auVar139);
      fVar118 = auVar19._0_4_;
      fVar120 = auVar19._4_4_;
      auVar48._4_4_ = auVar139._4_4_ * fVar120;
      auVar48._0_4_ = auVar139._0_4_ * fVar118;
      fVar122 = auVar19._8_4_;
      auVar48._8_4_ = auVar139._8_4_ * fVar122;
      fVar117 = auVar19._12_4_;
      auVar48._12_4_ = auVar139._12_4_ * fVar117;
      fVar119 = auVar19._16_4_;
      auVar48._16_4_ = auVar139._16_4_ * fVar119;
      fVar121 = auVar19._20_4_;
      auVar48._20_4_ = auVar139._20_4_ * fVar121;
      fVar123 = auVar19._24_4_;
      auVar48._24_4_ = auVar139._24_4_ * fVar123;
      auVar48._28_4_ = fVar240;
      auVar283._8_4_ = 0x3f800000;
      auVar283._0_8_ = 0x3f8000003f800000;
      auVar283._12_4_ = 0x3f800000;
      auVar283._16_4_ = 0x3f800000;
      auVar283._20_4_ = 0x3f800000;
      auVar283._24_4_ = 0x3f800000;
      auVar283._28_4_ = 0x3f800000;
      auVar104 = vsubps_avx(auVar283,auVar48);
      auVar19 = vandps_avx(auVar305,auVar139);
      auVar365._8_4_ = 0x219392ef;
      auVar365._0_8_ = 0x219392ef219392ef;
      auVar365._12_4_ = 0x219392ef;
      auVar365._16_4_ = 0x219392ef;
      auVar365._20_4_ = 0x219392ef;
      auVar365._24_4_ = 0x219392ef;
      auVar365._28_4_ = 0x219392ef;
      auVar20 = vcmpps_avx(auVar19,auVar365,1);
      auVar49._4_4_ =
           (fVar120 + fVar120 * auVar104._4_4_) *
           -(fVar340 * fVar236 + fVar327 * fVar247 + fVar315 * fVar351);
      auVar49._0_4_ =
           (fVar118 + fVar118 * auVar104._0_4_) *
           -(fVar334 * fVar278 + fVar322 * fVar216 + fVar312 * fVar346);
      auVar49._8_4_ =
           (fVar122 + fVar122 * auVar104._8_4_) *
           -(fVar341 * fVar257 + fVar328 * fVar256 + fVar316 * fVar353);
      auVar49._12_4_ =
           (fVar117 + fVar117 * auVar104._12_4_) *
           -(fVar342 * fVar274 + fVar329 * fVar273 + fVar317 * fVar355);
      auVar49._16_4_ =
           (fVar119 + fVar119 * auVar104._16_4_) *
           -(fVar343 * fVar295 + fVar330 * fVar293 + fVar318 * fVar357);
      auVar49._20_4_ =
           (fVar121 + fVar121 * auVar104._20_4_) *
           -(fVar344 * fVar368 + fVar331 * fVar367 + fVar319 * fVar359);
      auVar49._24_4_ =
           (fVar123 + fVar123 * auVar104._24_4_) *
           -(fVar345 * fVar13 + fVar332 * fVar12 + fVar320 * fVar361);
      auVar49._28_4_ = -(auVar22._28_4_ + fVar240);
      auVar19 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,1);
      auVar19 = vorps_avx(auVar20,auVar19);
      auVar338._8_4_ = 0xff800000;
      auVar338._0_8_ = 0xff800000ff800000;
      auVar338._12_4_ = 0xff800000;
      auVar338._16_4_ = 0xff800000;
      auVar338._20_4_ = 0xff800000;
      auVar338._24_4_ = 0xff800000;
      auVar338._28_4_ = 0xff800000;
      auVar19 = vblendvps_avx(auVar49,auVar338,auVar19);
      auVar22 = vcmpps_avx(auVar139,ZEXT832(0) << 0x20,6);
      auVar20 = vorps_avx(auVar20,auVar22);
      auVar350._8_4_ = 0x7f800000;
      auVar350._0_8_ = 0x7f8000007f800000;
      auVar350._12_4_ = 0x7f800000;
      auVar350._16_4_ = 0x7f800000;
      auVar350._20_4_ = 0x7f800000;
      auVar350._24_4_ = 0x7f800000;
      auVar350._28_4_ = 0x7f800000;
      auVar20 = vblendvps_avx(auVar49,auVar350,auVar20);
      auVar22 = vmaxps_avx(local_340,auVar138);
      auVar22 = vmaxps_avx(auVar22,auVar19);
      auVar24 = vminps_avx(auVar24,auVar20);
      auVar104 = ZEXT832(0) << 0x20;
      auVar19 = vsubps_avx(auVar104,local_ac0);
      auVar20 = vsubps_avx(auVar104,auVar192);
      auVar50._4_4_ = auVar20._4_4_ * -fVar352;
      auVar50._0_4_ = auVar20._0_4_ * -fVar347;
      auVar50._8_4_ = auVar20._8_4_ * -fVar354;
      auVar50._12_4_ = auVar20._12_4_ * -fVar356;
      auVar50._16_4_ = auVar20._16_4_ * -fVar358;
      auVar50._20_4_ = auVar20._20_4_ * -fVar360;
      auVar50._24_4_ = auVar20._24_4_ * -fVar362;
      auVar50._28_4_ = auVar20._28_4_;
      auVar51._4_4_ = fVar234 * auVar19._4_4_;
      auVar51._0_4_ = fVar215 * auVar19._0_4_;
      auVar51._8_4_ = fVar253 * auVar19._8_4_;
      auVar51._12_4_ = fVar265 * auVar19._12_4_;
      auVar51._16_4_ = fVar287 * auVar19._16_4_;
      auVar51._20_4_ = fVar311 * auVar19._20_4_;
      auVar51._24_4_ = fVar10 * auVar19._24_4_;
      auVar51._28_4_ = auVar19._28_4_;
      auVar19 = vsubps_avx(auVar50,auVar51);
      auVar20 = vsubps_avx(auVar104,auVar17);
      auVar52._4_4_ = fVar235 * auVar20._4_4_;
      auVar52._0_4_ = fVar198 * auVar20._0_4_;
      auVar52._8_4_ = fVar254 * auVar20._8_4_;
      auVar52._12_4_ = fVar272 * auVar20._12_4_;
      auVar52._16_4_ = fVar290 * auVar20._16_4_;
      auVar52._20_4_ = fVar333 * auVar20._20_4_;
      uVar87 = auVar20._28_4_;
      auVar52._24_4_ = fVar11 * auVar20._24_4_;
      auVar52._28_4_ = uVar87;
      auVar20 = vsubps_avx(auVar19,auVar52);
      auVar53._4_4_ = (float)local_920._4_4_ * -fVar352;
      auVar53._0_4_ = (float)local_920._0_4_ * -fVar347;
      auVar53._8_4_ = fStack_918 * -fVar354;
      auVar53._12_4_ = fStack_914 * -fVar356;
      auVar53._16_4_ = fStack_910 * -fVar358;
      auVar53._20_4_ = fStack_90c * -fVar360;
      auVar53._24_4_ = fStack_908 * -fVar362;
      auVar53._28_4_ = -fVar32;
      auVar54._4_4_ = (float)local_900._4_4_ * fVar234;
      auVar54._0_4_ = (float)local_900._0_4_ * fVar215;
      auVar54._8_4_ = fStack_8f8 * fVar253;
      auVar54._12_4_ = fStack_8f4 * fVar265;
      auVar54._16_4_ = fStack_8f0 * fVar287;
      auVar54._20_4_ = fStack_8ec * fVar311;
      auVar54._24_4_ = fStack_8e8 * fVar10;
      auVar54._28_4_ = uVar87;
      auVar323._8_4_ = 0x3f800000;
      auVar323._0_8_ = 0x3f8000003f800000;
      auVar323._12_4_ = 0x3f800000;
      auVar323._16_4_ = 0x3f800000;
      auVar323._20_4_ = 0x3f800000;
      auVar323._24_4_ = 0x3f800000;
      auVar323._28_4_ = 0x3f800000;
      auVar19 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = (float)local_8e0._4_4_ * fVar235;
      auVar55._0_4_ = (float)local_8e0._0_4_ * fVar198;
      auVar55._8_4_ = fStack_8d8 * fVar254;
      auVar55._12_4_ = fStack_8d4 * fVar272;
      auVar55._16_4_ = fStack_8d0 * fVar290;
      auVar55._20_4_ = fStack_8cc * fVar333;
      auVar55._24_4_ = fStack_8c8 * fVar11;
      auVar55._28_4_ = uVar87;
      auVar192 = vsubps_avx(auVar19,auVar55);
      auVar19 = vrcpps_avx(auVar192);
      fVar215 = auVar19._0_4_;
      fVar198 = auVar19._4_4_;
      auVar56._4_4_ = auVar192._4_4_ * fVar198;
      auVar56._0_4_ = auVar192._0_4_ * fVar215;
      fVar216 = auVar19._8_4_;
      auVar56._8_4_ = auVar192._8_4_ * fVar216;
      fVar278 = auVar19._12_4_;
      auVar56._12_4_ = auVar192._12_4_ * fVar278;
      fVar234 = auVar19._16_4_;
      auVar56._16_4_ = auVar192._16_4_ * fVar234;
      fVar235 = auVar19._20_4_;
      auVar56._20_4_ = auVar192._20_4_ * fVar235;
      fVar247 = auVar19._24_4_;
      auVar56._24_4_ = auVar192._24_4_ * fVar247;
      auVar56._28_4_ = fStack_8c4;
      auVar17 = vsubps_avx(auVar323,auVar56);
      auVar105._8_4_ = 0x7fffffff;
      auVar105._0_8_ = 0x7fffffff7fffffff;
      auVar105._12_4_ = 0x7fffffff;
      auVar105._16_4_ = 0x7fffffff;
      auVar105._20_4_ = 0x7fffffff;
      auVar105._24_4_ = 0x7fffffff;
      auVar105._28_4_ = 0x7fffffff;
      auVar19 = vandps_avx(auVar192,auVar105);
      auVar106._8_4_ = 0x219392ef;
      auVar106._0_8_ = 0x219392ef219392ef;
      auVar106._12_4_ = 0x219392ef;
      auVar106._16_4_ = 0x219392ef;
      auVar106._20_4_ = 0x219392ef;
      auVar106._24_4_ = 0x219392ef;
      auVar106._28_4_ = 0x219392ef;
      auVar19 = vcmpps_avx(auVar19,auVar106,1);
      auVar68 = ZEXT812(0);
      auVar314 = ZEXT1264(auVar68) << 0x20;
      auVar57._4_4_ = (fVar198 + fVar198 * auVar17._4_4_) * -auVar20._4_4_;
      auVar57._0_4_ = (fVar215 + fVar215 * auVar17._0_4_) * -auVar20._0_4_;
      auVar57._8_4_ = (fVar216 + fVar216 * auVar17._8_4_) * -auVar20._8_4_;
      auVar57._12_4_ = (fVar278 + fVar278 * auVar17._12_4_) * -auVar20._12_4_;
      auVar57._16_4_ = (fVar234 + fVar234 * auVar17._16_4_) * -auVar20._16_4_;
      auVar57._20_4_ = (fVar235 + fVar235 * auVar17._20_4_) * -auVar20._20_4_;
      auVar57._24_4_ = (fVar247 + fVar247 * auVar17._24_4_) * -auVar20._24_4_;
      auVar57._28_4_ = auVar20._28_4_ ^ 0x80000000;
      auVar20 = vcmpps_avx(auVar192,ZEXT1232(auVar68) << 0x20,1);
      auVar20 = vorps_avx(auVar19,auVar20);
      auVar20 = vblendvps_avx(auVar57,auVar338,auVar20);
      local_9c0 = vmaxps_avx(auVar22,auVar20);
      auVar20 = vcmpps_avx(auVar192,ZEXT1232(auVar68) << 0x20,6);
      auVar20 = vorps_avx(auVar19,auVar20);
      auVar20 = vblendvps_avx(auVar57,auVar350,auVar20);
      auVar101 = vandps_avx(auVar101,local_5c0);
      local_3e0 = vminps_avx(auVar24,auVar20);
      auVar20 = vcmpps_avx(local_9c0,local_3e0,2);
      auVar192 = auVar101 & auVar20;
      if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar192 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar192 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar192 >> 0x7f,0) == '\0') &&
            (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar192 >> 0xbf,0) == '\0') &&
          (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar192[0x1f]) {
        auVar305._8_4_ = 0x7fffffff;
        auVar305._0_8_ = 0x7fffffff7fffffff;
        auVar305._12_4_ = 0x7fffffff;
        auVar305._16_4_ = 0x7fffffff;
        auVar305._20_4_ = 0x7fffffff;
        auVar305._24_4_ = 0x7fffffff;
        auVar305._28_4_ = 0x7fffffff;
        goto LAB_007b79b0;
      }
      auVar19 = vminps_avx(_local_b40,auVar102);
      auVar192 = vminps_avx(auVar16,auVar21);
      auVar19 = vminps_avx(auVar19,auVar192);
      auVar192 = vsubps_avx(auVar19,local_2c0);
      auVar101 = vandps_avx(auVar20,auVar101);
      auVar76._4_4_ = fStack_35c;
      auVar76._0_4_ = local_360;
      auVar76._8_4_ = fStack_358;
      auVar76._12_4_ = fStack_354;
      auVar76._16_4_ = fStack_350;
      auVar76._20_4_ = fStack_34c;
      auVar76._24_4_ = fStack_348;
      auVar76._28_4_ = fStack_344;
      auVar19 = vminps_avx(auVar76,auVar323);
      auVar206 = SUB6428(ZEXT864(0),0) << 0x20;
      auVar19 = vmaxps_avx(auVar19,ZEXT832(0) << 0x20);
      fVar215 = DAT_01f7b060._28_4_;
      local_1a0[0] = fVar153 + fVar124 * (auVar19._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1a0[1] = fVar175 + fVar150 * (auVar19._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1a0[2] = fVar176 + fVar151 * (auVar19._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1a0[3] = fVar177 + fVar152 * (auVar19._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_190 = fVar153 + fVar124 * (auVar19._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_18c = fVar175 + fVar150 * (auVar19._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_188 = fVar176 + fVar151 * (auVar19._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_184 = fVar177 + auVar19._28_4_ + fVar215;
      auVar75._4_4_ = fStack_37c;
      auVar75._0_4_ = local_380;
      auVar75._8_4_ = fStack_378;
      auVar75._12_4_ = fStack_374;
      auVar75._16_4_ = fStack_370;
      auVar75._20_4_ = fStack_36c;
      auVar75._24_4_ = fStack_368;
      auVar75._28_4_ = fStack_364;
      auVar19 = vminps_avx(auVar75,auVar323);
      auVar19 = vmaxps_avx(auVar19,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar153 + fVar124 * (auVar19._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1c0[1] = fVar175 + fVar150 * (auVar19._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1c0[2] = fVar176 + fVar151 * (auVar19._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1c0[3] = fVar177 + fVar152 * (auVar19._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_1b0 = fVar153 + fVar124 * (auVar19._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_1ac = fVar175 + fVar150 * (auVar19._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_1a8 = fVar176 + fVar151 * (auVar19._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_1a4 = fVar177 + auVar19._28_4_ + fVar215;
      auVar58._4_4_ = auVar192._4_4_ * 0.99999976;
      auVar58._0_4_ = auVar192._0_4_ * 0.99999976;
      auVar58._8_4_ = auVar192._8_4_ * 0.99999976;
      auVar58._12_4_ = auVar192._12_4_ * 0.99999976;
      auVar58._16_4_ = auVar192._16_4_ * 0.99999976;
      auVar58._20_4_ = auVar192._20_4_ * 0.99999976;
      auVar58._24_4_ = auVar192._24_4_ * 0.99999976;
      auVar58._28_4_ = 0x3f7ffffc;
      auVar19 = vmaxps_avx(ZEXT1232(auVar68) << 0x20,auVar58);
      auVar59._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar59._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar59._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar59._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar59._16_4_ = auVar19._16_4_ * auVar19._16_4_;
      auVar59._20_4_ = auVar19._20_4_ * auVar19._20_4_;
      auVar59._24_4_ = auVar19._24_4_ * auVar19._24_4_;
      auVar59._28_4_ = auVar19._28_4_;
      local_a20 = vsubps_avx(auVar23,auVar59);
      auVar60._4_4_ = local_a20._4_4_ * fVar114 * 4.0;
      auVar60._0_4_ = local_a20._0_4_ * fVar199 * 4.0;
      auVar60._8_4_ = local_a20._8_4_ * fVar115 * 4.0;
      auVar60._12_4_ = local_a20._12_4_ * fVar116 * 4.0;
      auVar60._16_4_ = local_a20._16_4_ * fStack_890;
      auVar60._20_4_ = local_a20._20_4_ * fStack_88c;
      auVar60._24_4_ = local_a20._24_4_ * fStack_888;
      auVar60._28_4_ = auVar19._28_4_;
      auVar20 = vsubps_avx(auVar42,auVar60);
      auVar19 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,5);
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar19 >> 0x7f,0) == '\0') &&
            (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0xbf,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
      {
        auVar246 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar224 = SUB6428(ZEXT864(0),0) << 0x20;
        _local_b40 = ZEXT432(0) << 0x20;
        _local_ce0 = local_b40._0_28_;
        auVar284._8_4_ = 0x7f800000;
        auVar284._0_8_ = 0x7f8000007f800000;
        auVar284._12_4_ = 0x7f800000;
        auVar284._16_4_ = 0x7f800000;
        auVar284._20_4_ = 0x7f800000;
        auVar284._24_4_ = 0x7f800000;
        auVar284._28_4_ = 0x7f800000;
        auVar324._8_4_ = 0xff800000;
        auVar324._0_8_ = 0xff800000ff800000;
        auVar324._12_4_ = 0xff800000;
        auVar324._16_4_ = 0xff800000;
        auVar324._20_4_ = 0xff800000;
        auVar324._24_4_ = 0xff800000;
        auVar324._28_4_ = 0xff800000;
        local_a20 = auVar25;
      }
      else {
        auVar192 = vrcpps_avx(local_320);
        fVar199 = auVar192._0_4_;
        auVar209._0_4_ = local_320._0_4_ * fVar199;
        fVar198 = auVar192._4_4_;
        auVar209._4_4_ = local_320._4_4_ * fVar198;
        fVar216 = auVar192._8_4_;
        auVar209._8_4_ = local_320._8_4_ * fVar216;
        fVar278 = auVar192._12_4_;
        auVar209._12_4_ = local_320._12_4_ * fVar278;
        fVar234 = auVar192._16_4_;
        auVar209._16_4_ = local_320._16_4_ * fVar234;
        fVar235 = auVar192._20_4_;
        auVar209._20_4_ = local_320._20_4_ * fVar235;
        fVar247 = auVar192._24_4_;
        auVar209._24_4_ = local_320._24_4_ * fVar247;
        auVar209._28_4_ = 0;
        auVar17 = vsubps_avx(auVar323,auVar209);
        auVar16 = vsqrtps_avx(auVar20);
        fVar199 = fVar199 + fVar199 * auVar17._0_4_;
        fVar198 = fVar198 + fVar198 * auVar17._4_4_;
        fVar216 = fVar216 + fVar216 * auVar17._8_4_;
        fVar278 = fVar278 + fVar278 * auVar17._12_4_;
        fVar234 = fVar234 + fVar234 * auVar17._16_4_;
        fVar235 = fVar235 + fVar235 * auVar17._20_4_;
        fVar247 = fVar247 + fVar247 * auVar17._24_4_;
        auVar21 = vsubps_avx(local_a60,auVar16);
        fVar273 = auVar21._0_4_ * fVar199;
        fVar274 = auVar21._4_4_ * fVar198;
        auVar61._4_4_ = fVar274;
        auVar61._0_4_ = fVar273;
        fVar287 = auVar21._8_4_ * fVar216;
        auVar61._8_4_ = fVar287;
        fVar290 = auVar21._12_4_ * fVar278;
        auVar61._12_4_ = fVar290;
        fVar293 = auVar21._16_4_ * fVar234;
        auVar61._16_4_ = fVar293;
        fVar295 = auVar21._20_4_ * fVar235;
        auVar61._20_4_ = fVar295;
        fVar311 = auVar21._24_4_ * fVar247;
        auVar61._24_4_ = fVar311;
        auVar61._28_4_ = 0x3f800000;
        auVar21 = vsubps_avx(auVar16,local_3c0);
        fVar199 = auVar21._0_4_ * fVar199;
        fVar198 = auVar21._4_4_ * fVar198;
        auVar167._4_4_ = fVar198;
        auVar167._0_4_ = fVar199;
        fVar216 = auVar21._8_4_ * fVar216;
        auVar167._8_4_ = fVar216;
        fVar278 = auVar21._12_4_ * fVar278;
        auVar167._12_4_ = fVar278;
        fVar234 = auVar21._16_4_ * fVar234;
        auVar167._16_4_ = fVar234;
        fVar235 = auVar21._20_4_ * fVar235;
        auVar167._20_4_ = fVar235;
        fVar247 = auVar21._24_4_ * fVar247;
        auVar167._24_4_ = fVar247;
        auVar167._28_4_ = fVar177;
        fVar236 = (fVar273 * local_6a0 + local_6c0._0_4_) * fVar286;
        fVar253 = (fVar274 * fStack_69c + local_6c0._4_4_) * fVar248;
        fVar254 = (fVar287 * fStack_698 + local_6c0._8_4_) * fVar259;
        fVar256 = (fVar290 * fStack_694 + local_6c0._12_4_) * fVar275;
        fVar257 = (fVar293 * fStack_690 + local_6c0._16_4_) * fVar297;
        fVar265 = (fVar295 * fStack_68c + local_6c0._20_4_) * fVar237;
        fVar272 = (fVar311 * fStack_688 + local_6c0._24_4_) * fVar239;
        auVar108._0_4_ = local_a40 + fVar236 * fVar197;
        auVar108._4_4_ = fStack_a3c + fVar253 * fVar321;
        auVar108._8_4_ = fStack_a38 + fVar254 * fVar251;
        auVar108._12_4_ = fStack_a34 + fVar256 * fVar263;
        auVar108._16_4_ = fStack_a30 + fVar257 * fVar279;
        auVar108._20_4_ = fStack_a2c + fVar265 * fVar310;
        auVar108._24_4_ = fStack_a28 + fVar272 * fVar9;
        auVar108._28_4_ = fStack_a24 + auVar192._28_4_ + auVar17._28_4_ + local_6c0._28_4_;
        auVar62._4_4_ = (float)local_8e0._4_4_ * fVar274;
        auVar62._0_4_ = (float)local_8e0._0_4_ * fVar273;
        auVar62._8_4_ = fStack_8d8 * fVar287;
        auVar62._12_4_ = fStack_8d4 * fVar290;
        auVar62._16_4_ = fStack_8d0 * fVar293;
        auVar62._20_4_ = fStack_8cc * fVar295;
        auVar62._24_4_ = fStack_8c8 * fVar311;
        auVar62._28_4_ = auVar16._28_4_;
        local_ac0 = vsubps_avx(auVar62,auVar108);
        auVar229._0_4_ = fVar280 + fVar236 * fVar196;
        auVar229._4_4_ = fVar288 + fVar253 * fVar289;
        auVar229._8_4_ = fVar291 + fVar254 * fVar250;
        auVar229._12_4_ = fVar294 + fVar256 * fVar260;
        auVar229._16_4_ = fVar296 + fVar257 * fVar276;
        auVar229._20_4_ = fVar298 + fVar265 * fVar299;
        auVar229._24_4_ = fVar300 + fVar272 * fVar7;
        auVar229._28_4_ = fVar302 + auVar16._28_4_;
        auVar77._4_4_ = fVar274 * (float)local_900._4_4_;
        auVar77._0_4_ = fVar273 * (float)local_900._0_4_;
        auVar77._8_4_ = fVar287 * fStack_8f8;
        auVar77._12_4_ = fVar290 * fStack_8f4;
        auVar77._16_4_ = fVar293 * fStack_8f0;
        auVar77._20_4_ = fVar295 * fStack_8ec;
        auVar77._24_4_ = fVar311 * fStack_8e8;
        auVar77._28_4_ = fVar215;
        _local_b40 = vsubps_avx(auVar77,auVar229);
        auVar210._0_4_ = (float)local_d20._0_4_ + fVar214 * fVar236;
        auVar210._4_4_ = (float)local_d20._4_4_ + fVar292 * fVar253;
        auVar210._8_4_ = fStack_d18 + fVar238 * fVar254;
        auVar210._12_4_ = fStack_d14 + fVar262 * fVar256;
        auVar210._16_4_ = fStack_d10 + fVar277 * fVar257;
        auVar210._20_4_ = fStack_d0c + fVar301 * fVar265;
        auVar210._24_4_ = fStack_d08 + fVar8 * fVar272;
        auVar210._28_4_ = fStack_d04 + auVar21._28_4_;
        auVar63._4_4_ = (float)local_920._4_4_ * fVar274;
        auVar63._0_4_ = (float)local_920._0_4_ * fVar273;
        auVar63._8_4_ = fStack_918 * fVar287;
        auVar63._12_4_ = fStack_914 * fVar290;
        auVar63._16_4_ = fStack_910 * fVar293;
        auVar63._20_4_ = fStack_90c * fVar295;
        auVar63._24_4_ = fStack_908 * fVar311;
        auVar63._28_4_ = local_b40._28_4_;
        auVar192 = vsubps_avx(auVar63,auVar210);
        _local_ce0 = auVar192._0_28_;
        fVar286 = (fVar199 * local_6a0 + local_6c0._0_4_) * fVar286;
        fVar248 = (fVar198 * fStack_69c + local_6c0._4_4_) * fVar248;
        fVar259 = (fVar216 * fStack_698 + local_6c0._8_4_) * fVar259;
        fVar275 = (fVar278 * fStack_694 + local_6c0._12_4_) * fVar275;
        fVar297 = (fVar234 * fStack_690 + local_6c0._16_4_) * fVar297;
        fVar237 = (fVar235 * fStack_68c + local_6c0._20_4_) * fVar237;
        fVar239 = (fVar247 * fStack_688 + local_6c0._24_4_) * fVar239;
        auVar211._0_4_ = local_a40 + fVar286 * fVar197;
        auVar211._4_4_ = fStack_a3c + fVar248 * fVar321;
        auVar211._8_4_ = fStack_a38 + fVar259 * fVar251;
        auVar211._12_4_ = fStack_a34 + fVar275 * fVar263;
        auVar211._16_4_ = fStack_a30 + fVar297 * fVar279;
        auVar211._20_4_ = fStack_a2c + fVar237 * fVar310;
        auVar211._24_4_ = fStack_a28 + fVar239 * fVar9;
        auVar211._28_4_ = fStack_a24 + auVar192._28_4_ + local_6c0._28_4_;
        auVar64._4_4_ = (float)local_8e0._4_4_ * fVar198;
        auVar64._0_4_ = (float)local_8e0._0_4_ * fVar199;
        auVar64._8_4_ = fStack_8d8 * fVar216;
        auVar64._12_4_ = fStack_8d4 * fVar278;
        auVar64._16_4_ = fStack_8d0 * fVar234;
        auVar64._20_4_ = fStack_8cc * fVar235;
        auVar64._24_4_ = fStack_8c8 * fVar247;
        auVar64._28_4_ = fVar215;
        auVar192 = vsubps_avx(auVar64,auVar211);
        auVar206 = auVar192._0_28_;
        auVar245._0_4_ = fVar280 + fVar286 * fVar196;
        auVar245._4_4_ = fVar288 + fVar248 * fVar289;
        auVar245._8_4_ = fVar291 + fVar259 * fVar250;
        auVar245._12_4_ = fVar294 + fVar275 * fVar260;
        auVar245._16_4_ = fVar296 + fVar297 * fVar276;
        auVar245._20_4_ = fVar298 + fVar237 * fVar299;
        auVar245._24_4_ = fVar300 + fVar239 * fVar7;
        auVar245._28_4_ = fVar302 + fVar215;
        auVar65._4_4_ = (float)local_900._4_4_ * fVar198;
        auVar65._0_4_ = (float)local_900._0_4_ * fVar199;
        auVar65._8_4_ = fStack_8f8 * fVar216;
        auVar65._12_4_ = fStack_8f4 * fVar278;
        auVar65._16_4_ = fStack_8f0 * fVar234;
        auVar65._20_4_ = fStack_8ec * fVar235;
        auVar65._24_4_ = fStack_8e8 * fVar247;
        auVar65._28_4_ = fStack_8c4;
        auVar192 = vsubps_avx(auVar65,auVar245);
        auVar246 = ZEXT3264(auVar192);
        auVar230._0_4_ = (float)local_d20._0_4_ + fVar214 * fVar286;
        auVar230._4_4_ = (float)local_d20._4_4_ + fVar292 * fVar248;
        auVar230._8_4_ = fStack_d18 + fVar238 * fVar259;
        auVar230._12_4_ = fStack_d14 + fVar262 * fVar275;
        auVar230._16_4_ = fStack_d10 + fVar277 * fVar297;
        auVar230._20_4_ = fStack_d0c + fVar301 * fVar237;
        auVar230._24_4_ = fStack_d08 + fVar8 * fVar239;
        auVar230._28_4_ = fStack_d04 + local_b40._28_4_;
        auVar66._4_4_ = (float)local_920._4_4_ * fVar198;
        auVar66._0_4_ = (float)local_920._0_4_ * fVar199;
        auVar66._8_4_ = fStack_918 * fVar216;
        auVar66._12_4_ = fStack_914 * fVar278;
        auVar66._16_4_ = fStack_910 * fVar234;
        auVar66._20_4_ = fStack_90c * fVar235;
        auVar66._24_4_ = fStack_908 * fVar247;
        auVar66._28_4_ = fStack_8c4;
        auVar192 = vsubps_avx(auVar66,auVar230);
        auVar224 = auVar192._0_28_;
        auVar20 = vcmpps_avx(auVar20,_DAT_01f7b000,5);
        auVar285._8_4_ = 0x7f800000;
        auVar285._0_8_ = 0x7f8000007f800000;
        auVar285._12_4_ = 0x7f800000;
        auVar285._16_4_ = 0x7f800000;
        auVar285._20_4_ = 0x7f800000;
        auVar285._24_4_ = 0x7f800000;
        auVar285._28_4_ = 0x7f800000;
        auVar284 = vblendvps_avx(auVar285,auVar61,auVar20);
        auVar192 = vmaxps_avx(local_620,local_300);
        auVar67._4_4_ = auVar192._4_4_ * 1.9073486e-06;
        auVar67._0_4_ = auVar192._0_4_ * 1.9073486e-06;
        auVar67._8_4_ = auVar192._8_4_ * 1.9073486e-06;
        auVar67._12_4_ = auVar192._12_4_ * 1.9073486e-06;
        auVar67._16_4_ = auVar192._16_4_ * 1.9073486e-06;
        auVar67._20_4_ = auVar192._20_4_ * 1.9073486e-06;
        auVar67._24_4_ = auVar192._24_4_ * 1.9073486e-06;
        auVar67._28_4_ = auVar192._28_4_;
        auVar192 = vcmpps_avx(local_3a0,auVar67,1);
        auVar325._8_4_ = 0xff800000;
        auVar325._0_8_ = 0xff800000ff800000;
        auVar325._12_4_ = 0xff800000;
        auVar325._16_4_ = 0xff800000;
        auVar325._20_4_ = 0xff800000;
        auVar325._24_4_ = 0xff800000;
        auVar325._28_4_ = 0xff800000;
        auVar324 = vblendvps_avx(auVar325,auVar167,auVar20);
        auVar16 = auVar20 & auVar192;
        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0x7f,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0xbf,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar16[0x1f] < '\0') {
          auVar19 = vandps_avx(auVar192,auVar20);
          auVar219 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
          auVar16 = vcmpps_avx(local_a20,_DAT_01f7b000,2);
          auVar167._8_4_ = 0xff800000;
          auVar167._0_8_ = 0xff800000ff800000;
          auVar167._12_4_ = 0xff800000;
          auVar167._16_4_ = 0xff800000;
          auVar167._20_4_ = 0xff800000;
          auVar167._24_4_ = 0xff800000;
          auVar167._28_4_ = 0xff800000;
          auVar313._8_4_ = 0x7f800000;
          auVar313._0_8_ = 0x7f8000007f800000;
          auVar313._12_4_ = 0x7f800000;
          auVar313._16_4_ = 0x7f800000;
          auVar313._20_4_ = 0x7f800000;
          auVar313._24_4_ = 0x7f800000;
          auVar313._28_4_ = 0x7f800000;
          auVar192 = vblendvps_avx(auVar313,auVar167,auVar16);
          auVar15 = vpmovsxwd_avx(auVar219);
          auVar219 = vpunpckhwd_avx(auVar219,auVar219);
          auVar366._16_16_ = auVar219;
          auVar366._0_16_ = auVar15;
          auVar284 = vblendvps_avx(auVar284,auVar192,auVar366);
          auVar192 = vblendvps_avx(auVar167,auVar313,auVar16);
          auVar324 = vblendvps_avx(auVar324,auVar192,auVar366);
          auVar195._0_8_ = auVar19._0_8_ ^ 0xffffffffffffffff;
          auVar195._8_4_ = auVar19._8_4_ ^ 0xffffffff;
          auVar195._12_4_ = auVar19._12_4_ ^ 0xffffffff;
          auVar195._16_4_ = auVar19._16_4_ ^ 0xffffffff;
          auVar195._20_4_ = auVar19._20_4_ ^ 0xffffffff;
          auVar195._24_4_ = auVar19._24_4_ ^ 0xffffffff;
          auVar195._28_4_ = auVar19._28_4_ ^ 0xffffffff;
          auVar19 = vorps_avx(auVar16,auVar195);
          auVar19 = vandps_avx(auVar20,auVar19);
        }
        auVar314 = ZEXT3264(local_ac0);
      }
      auVar326 = ZEXT3264(auVar324);
      auVar271 = ZEXT3264(auVar167);
      auVar339 = ZEXT3264(local_9c0);
      _local_440 = local_9c0;
      local_420 = vminps_avx(local_3e0,auVar284);
      auVar192 = vmaxps_avx(local_9c0,auVar324);
      _local_400 = auVar192;
      auVar20 = vcmpps_avx(local_9c0,local_420,2);
      local_820 = vandps_avx(auVar20,auVar101);
      auVar20 = vcmpps_avx(auVar192,local_3e0,2);
      auVar101 = vandps_avx(auVar101,auVar20);
      auVar20 = vorps_avx(local_820,auVar101);
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar271 = ZEXT3264(_local_920);
        fVar199 = auVar246._0_4_;
        fVar196 = auVar246._4_4_;
        fVar214 = auVar246._8_4_;
        fVar197 = auVar246._12_4_;
        fVar215 = auVar246._16_4_;
        fVar198 = auVar246._20_4_;
        fVar216 = auVar246._24_4_;
        auVar246 = ZEXT3264(_local_900);
        auVar170._0_8_ = auVar19._0_8_ ^ 0xffffffffffffffff;
        auVar170._8_4_ = auVar19._8_4_ ^ 0xffffffff;
        auVar170._12_4_ = auVar19._12_4_ ^ 0xffffffff;
        auVar170._16_4_ = auVar19._16_4_ ^ 0xffffffff;
        auVar170._20_4_ = auVar19._20_4_ ^ 0xffffffff;
        auVar170._24_4_ = auVar19._24_4_ ^ 0xffffffff;
        fVar278 = auVar19._28_4_;
        auVar170._28_4_ = (uint)fVar278 ^ 0xffffffff;
        auVar326 = ZEXT3264(local_820);
        auVar140._0_4_ =
             (float)local_8e0._0_4_ * auVar206._0_4_ +
             (float)local_900._0_4_ * fVar199 + (float)local_920._0_4_ * auVar224._0_4_;
        auVar140._4_4_ =
             (float)local_8e0._4_4_ * auVar206._4_4_ +
             (float)local_900._4_4_ * fVar196 + (float)local_920._4_4_ * auVar224._4_4_;
        auVar140._8_4_ =
             fStack_8d8 * auVar206._8_4_ + fStack_8f8 * fVar214 + fStack_918 * auVar224._8_4_;
        auVar140._12_4_ =
             fStack_8d4 * auVar206._12_4_ + fStack_8f4 * fVar197 + fStack_914 * auVar224._12_4_;
        auVar140._16_4_ =
             fStack_8d0 * auVar206._16_4_ + fStack_8f0 * fVar215 + fStack_910 * auVar224._16_4_;
        auVar140._20_4_ =
             fStack_8cc * auVar206._20_4_ + fStack_8ec * fVar198 + fStack_90c * auVar224._20_4_;
        auVar140._24_4_ =
             fStack_8c8 * auVar206._24_4_ + fStack_8e8 * fVar216 + fStack_908 * auVar224._24_4_;
        auVar140._28_4_ = fVar278 + auVar101._28_4_ + auVar20._28_4_;
        auVar212._8_4_ = 0x7fffffff;
        auVar212._0_8_ = 0x7fffffff7fffffff;
        auVar212._12_4_ = 0x7fffffff;
        auVar212._16_4_ = 0x7fffffff;
        auVar212._20_4_ = 0x7fffffff;
        auVar212._24_4_ = 0x7fffffff;
        auVar212._28_4_ = 0x7fffffff;
        auVar19 = vandps_avx(auVar140,auVar212);
        auVar231._8_4_ = 0x3e99999a;
        auVar231._0_8_ = 0x3e99999a3e99999a;
        auVar231._12_4_ = 0x3e99999a;
        auVar231._16_4_ = 0x3e99999a;
        auVar231._20_4_ = 0x3e99999a;
        auVar231._24_4_ = 0x3e99999a;
        auVar231._28_4_ = 0x3e99999a;
        auVar19 = vcmpps_avx(auVar19,auVar231,1);
        local_860 = vorps_avx(auVar19,auVar170);
        auVar109._0_4_ =
             (float)local_8e0._0_4_ * auVar314._0_4_ +
             (float)local_900._0_4_ * (float)local_b40._0_4_ +
             (float)local_920._0_4_ * (float)local_ce0._0_4_;
        auVar109._4_4_ =
             (float)local_8e0._4_4_ * auVar314._4_4_ +
             (float)local_900._4_4_ * (float)local_b40._4_4_ +
             (float)local_920._4_4_ * (float)local_ce0._4_4_;
        auVar109._8_4_ =
             fStack_8d8 * auVar314._8_4_ + fStack_8f8 * fStack_b38 + fStack_918 * fStack_cd8;
        auVar109._12_4_ =
             fStack_8d4 * auVar314._12_4_ + fStack_8f4 * fStack_b34 + fStack_914 * fStack_cd4;
        auVar109._16_4_ =
             fStack_8d0 * auVar314._16_4_ + fStack_8f0 * fStack_b30 + fStack_910 * fStack_cd0;
        auVar109._20_4_ =
             fStack_8cc * auVar314._20_4_ + fStack_8ec * fStack_b2c + fStack_90c * fStack_ccc;
        auVar109._24_4_ =
             fStack_8c8 * auVar314._24_4_ + fStack_8e8 * fStack_b28 + fStack_908 * fStack_cc8;
        auVar109._28_4_ = local_860._28_4_ + auVar19._28_4_ + fVar278;
        auVar19 = vandps_avx(auVar109,auVar212);
        auVar19 = vcmpps_avx(auVar19,auVar231,1);
        auVar19 = vorps_avx(auVar19,auVar170);
        auVar141._8_4_ = 3;
        auVar141._0_8_ = 0x300000003;
        auVar141._12_4_ = 3;
        auVar141._16_4_ = 3;
        auVar141._20_4_ = 3;
        auVar141._24_4_ = 3;
        auVar141._28_4_ = 3;
        auVar171._8_4_ = 2;
        auVar171._0_8_ = 0x200000002;
        auVar171._12_4_ = 2;
        auVar171._16_4_ = 2;
        auVar171._20_4_ = 2;
        auVar171._24_4_ = 2;
        auVar171._28_4_ = 2;
        auVar19 = vblendvps_avx(auVar171,auVar141,auVar19);
        local_880 = ZEXT432(local_d2c);
        local_8a0 = vpshufd_avx(ZEXT416(local_d2c),0);
        auVar219 = vpcmpgtd_avx(auVar19._16_16_,local_8a0);
        auVar15 = vpcmpgtd_avx(auVar19._0_16_,local_8a0);
        auVar142._16_16_ = auVar219;
        auVar142._0_16_ = auVar15;
        local_840 = vblendps_avx(ZEXT1632(auVar15),auVar142,0xf0);
        local_460 = vandnps_avx(local_840,local_820);
        local_9a0._4_4_ = local_9c0._4_4_ + (float)local_8c0._4_4_;
        local_9a0._0_4_ = local_9c0._0_4_ + (float)local_8c0._0_4_;
        fStack_998 = local_9c0._8_4_ + fStack_8b8;
        fStack_994 = local_9c0._12_4_ + fStack_8b4;
        fStack_990 = local_9c0._16_4_ + fStack_8b0;
        fStack_98c = local_9c0._20_4_ + fStack_8ac;
        fStack_988 = local_9c0._24_4_ + fStack_8a8;
        fStack_984 = local_9c0._28_4_ + fStack_8a4;
        for (; (((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_460 >> 0x7f,0) != '\0') ||
                 (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_460 >> 0xbf,0) != '\0') ||
               (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_460[0x1f] < '\0'; local_460 = vandps_avx(auVar19,local_460)) {
          auVar143._8_4_ = 0x7f800000;
          auVar143._0_8_ = 0x7f8000007f800000;
          auVar143._12_4_ = 0x7f800000;
          auVar143._16_4_ = 0x7f800000;
          auVar143._20_4_ = 0x7f800000;
          auVar143._24_4_ = 0x7f800000;
          auVar143._28_4_ = 0x7f800000;
          auVar19 = vblendvps_avx(auVar143,local_9c0,local_460);
          auVar20 = vshufps_avx(auVar19,auVar19,0xb1);
          auVar20 = vminps_avx(auVar19,auVar20);
          auVar16 = vshufpd_avx(auVar20,auVar20,5);
          auVar20 = vminps_avx(auVar20,auVar16);
          auVar16 = vperm2f128_avx(auVar20,auVar20,1);
          auVar20 = vminps_avx(auVar20,auVar16);
          auVar20 = vcmpps_avx(auVar19,auVar20,0);
          auVar16 = local_460 & auVar20;
          auVar19 = local_460;
          if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0x7f,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0xbf,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar16[0x1f] < '\0') {
            auVar19 = vandps_avx(auVar20,local_460);
          }
          uVar79 = vmovmskps_avx(auVar19);
          uVar84 = 0;
          if (uVar79 != 0) {
            for (; (uVar79 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
            }
          }
          uVar81 = (ulong)uVar84;
          *(undefined4 *)(local_460 + uVar81 * 4) = 0;
          fVar199 = local_1a0[uVar81];
          uVar84 = *(uint *)(local_440 + uVar81 * 4);
          fVar196 = auVar127._0_4_;
          if ((float)local_a80._0_4_ < 0.0) {
            auVar246 = ZEXT1664(auVar246._0_16_);
            auVar314 = ZEXT1664(auVar314._0_16_);
            auVar326 = ZEXT1664(auVar326._0_16_);
            auVar339 = ZEXT1664(auVar339._0_16_);
            fVar196 = sqrtf((float)local_a80._0_4_);
            uVar81 = extraout_RAX;
          }
          auVar271 = ZEXT464((uint)fVar199);
          auVar15 = vminps_avx(_local_b50,_local_b70);
          auVar219 = vmaxps_avx(_local_b50,_local_b70);
          auVar156 = vminps_avx(_local_b60,_local_b80);
          auVar95 = vminps_avx(auVar15,auVar156);
          auVar15 = vmaxps_avx(_local_b60,_local_b80);
          auVar156 = vmaxps_avx(auVar219,auVar15);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar219 = vandps_avx(auVar95,auVar182);
          auVar15 = vandps_avx(auVar156,auVar182);
          auVar219 = vmaxps_avx(auVar219,auVar15);
          auVar15 = vmovshdup_avx(auVar219);
          auVar15 = vmaxss_avx(auVar15,auVar219);
          auVar219 = vshufpd_avx(auVar219,auVar219,1);
          auVar219 = vmaxss_avx(auVar219,auVar15);
          local_b40._0_4_ = auVar219._0_4_ * 1.9073486e-06;
          local_a20._0_4_ = fVar196 * 1.9073486e-06;
          local_a60._0_16_ = vshufps_avx(auVar156,auVar156,0xff);
          auVar219 = vinsertps_avx(ZEXT416(uVar84),ZEXT416((uint)fVar199),0x10);
          for (uVar88 = 0; bVar78 = (byte)uVar81, uVar88 != 5; uVar88 = uVar88 + 1) {
            auVar15 = vmovshdup_avx(auVar219);
            fVar199 = auVar15._0_4_;
            fVar215 = 1.0 - fVar199;
            fVar196 = fVar215 * fVar215 * fVar215;
            fVar214 = fVar199 * fVar199 * fVar199;
            fVar197 = fVar199 * fVar215;
            auVar15 = vshufps_avx(ZEXT416((uint)(fVar214 * 0.16666667)),
                                  ZEXT416((uint)(fVar214 * 0.16666667)),0);
            auVar156 = ZEXT416((uint)((fVar214 * 4.0 + fVar196 +
                                      fVar199 * fVar197 * 12.0 + fVar215 * fVar197 * 6.0) *
                                     0.16666667));
            auVar156 = vshufps_avx(auVar156,auVar156,0);
            auVar95 = ZEXT416((uint)((fVar196 * 4.0 + fVar214 +
                                     fVar215 * fVar197 * 12.0 + fVar199 * fVar197 * 6.0) *
                                    0.16666667));
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar91 = vshufps_avx(auVar219,auVar219,0);
            auVar157._0_4_ = auVar91._0_4_ * (float)local_a70._0_4_ + 0.0;
            auVar157._4_4_ = auVar91._4_4_ * (float)local_a70._4_4_ + 0.0;
            auVar157._8_4_ = auVar91._8_4_ * fStack_a68 + 0.0;
            auVar157._12_4_ = auVar91._12_4_ * fStack_a64 + 0.0;
            auVar91 = vshufps_avx(ZEXT416((uint)(fVar196 * 0.16666667)),
                                  ZEXT416((uint)(fVar196 * 0.16666667)),0);
            auVar93._0_4_ =
                 auVar91._0_4_ * (float)local_b50._0_4_ +
                 auVar95._0_4_ * (float)local_b70._0_4_ +
                 auVar15._0_4_ * (float)local_b80._0_4_ + auVar156._0_4_ * (float)local_b60._0_4_;
            auVar93._4_4_ =
                 auVar91._4_4_ * (float)local_b50._4_4_ +
                 auVar95._4_4_ * (float)local_b70._4_4_ +
                 auVar15._4_4_ * (float)local_b80._4_4_ + auVar156._4_4_ * (float)local_b60._4_4_;
            auVar93._8_4_ =
                 auVar91._8_4_ * fStack_b48 +
                 auVar95._8_4_ * fStack_b68 +
                 auVar15._8_4_ * fStack_b78 + auVar156._8_4_ * fStack_b58;
            auVar93._12_4_ =
                 auVar91._12_4_ * fStack_b44 +
                 auVar95._12_4_ * fStack_b64 +
                 auVar15._12_4_ * fStack_b74 + auVar156._12_4_ * fStack_b54;
            local_ac0._0_16_ = auVar93;
            auVar15 = vsubps_avx(auVar157,auVar93);
            local_a40 = auVar15._0_4_;
            fStack_a3c = auVar15._4_4_;
            fStack_a38 = auVar15._8_4_;
            fStack_a34 = auVar15._12_4_;
            auVar15 = vdpps_avx(auVar15,auVar15,0x7f);
            fVar196 = auVar15._0_4_;
            if (fVar196 < 0.0) {
              fVar214 = sqrtf(fVar196);
              uVar81 = extraout_RAX_00;
            }
            else {
              auVar156 = vsqrtss_avx(auVar15,auVar15);
              fVar214 = auVar156._0_4_;
            }
            auVar156 = ZEXT416((uint)(fVar199 * fVar199 * 0.5));
            auVar156 = vshufps_avx(auVar156,auVar156,0);
            auVar95 = ZEXT416((uint)((fVar215 * fVar215 + fVar197 * 4.0) * 0.5));
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar91 = ZEXT416((uint)((fVar199 * -fVar199 - fVar197 * 4.0) * 0.5));
            auVar91 = vshufps_avx(auVar91,auVar91,0);
            auVar94 = ZEXT416((uint)(fVar215 * -fVar215 * 0.5));
            auVar94 = vshufps_avx(auVar94,auVar94,0);
            auVar281._0_4_ =
                 (float)local_b50._0_4_ * auVar94._0_4_ +
                 (float)local_b70._0_4_ * auVar91._0_4_ +
                 (float)local_b80._0_4_ * auVar156._0_4_ + (float)local_b60._0_4_ * auVar95._0_4_;
            auVar281._4_4_ =
                 (float)local_b50._4_4_ * auVar94._4_4_ +
                 (float)local_b70._4_4_ * auVar91._4_4_ +
                 (float)local_b80._4_4_ * auVar156._4_4_ + (float)local_b60._4_4_ * auVar95._4_4_;
            auVar281._8_4_ =
                 fStack_b48 * auVar94._8_4_ +
                 fStack_b68 * auVar91._8_4_ +
                 fStack_b78 * auVar156._8_4_ + fStack_b58 * auVar95._8_4_;
            auVar281._12_4_ =
                 fStack_b44 * auVar94._12_4_ +
                 fStack_b64 * auVar91._12_4_ +
                 fStack_b74 * auVar156._12_4_ + fStack_b54 * auVar95._12_4_;
            auVar156 = vshufps_avx(auVar219,auVar219,0x55);
            auVar95 = ZEXT416((uint)(fVar215 - (fVar199 + fVar199)));
            auVar91 = vshufps_avx(auVar95,auVar95,0);
            auVar95 = ZEXT416((uint)(fVar199 - (fVar215 + fVar215)));
            auVar94 = vshufps_avx(auVar95,auVar95,0);
            auVar90 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
            auVar95 = vdpps_avx(auVar281,auVar281,0x7f);
            auVar129._0_4_ =
                 (float)local_b50._0_4_ * auVar90._0_4_ +
                 (float)local_b70._0_4_ * auVar94._0_4_ +
                 (float)local_b80._0_4_ * auVar156._0_4_ + (float)local_b60._0_4_ * auVar91._0_4_;
            auVar129._4_4_ =
                 (float)local_b50._4_4_ * auVar90._4_4_ +
                 (float)local_b70._4_4_ * auVar94._4_4_ +
                 (float)local_b80._4_4_ * auVar156._4_4_ + (float)local_b60._4_4_ * auVar91._4_4_;
            auVar129._8_4_ =
                 fStack_b48 * auVar90._8_4_ +
                 fStack_b68 * auVar94._8_4_ +
                 fStack_b78 * auVar156._8_4_ + fStack_b58 * auVar91._8_4_;
            auVar129._12_4_ =
                 fStack_b44 * auVar90._12_4_ +
                 fStack_b64 * auVar94._12_4_ +
                 fStack_b74 * auVar156._12_4_ + fStack_b54 * auVar91._12_4_;
            auVar156 = vblendps_avx(auVar95,_DAT_01f45a50,0xe);
            auVar91 = vrsqrtss_avx(auVar156,auVar156);
            fVar197 = auVar91._0_4_;
            fVar199 = auVar95._0_4_;
            auVar91 = vdpps_avx(auVar281,auVar129,0x7f);
            auVar94 = vshufps_avx(auVar95,auVar95,0);
            auVar130._0_4_ = auVar129._0_4_ * auVar94._0_4_;
            auVar130._4_4_ = auVar129._4_4_ * auVar94._4_4_;
            auVar130._8_4_ = auVar129._8_4_ * auVar94._8_4_;
            auVar130._12_4_ = auVar129._12_4_ * auVar94._12_4_;
            auVar91 = vshufps_avx(auVar91,auVar91,0);
            auVar202._0_4_ = auVar281._0_4_ * auVar91._0_4_;
            auVar202._4_4_ = auVar281._4_4_ * auVar91._4_4_;
            auVar202._8_4_ = auVar281._8_4_ * auVar91._8_4_;
            auVar202._12_4_ = auVar281._12_4_ * auVar91._12_4_;
            auVar90 = vsubps_avx(auVar130,auVar202);
            auVar91 = vrcpss_avx(auVar156,auVar156);
            auVar156 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                  ZEXT416((uint)(auVar219._0_4_ * (float)local_a20._0_4_)));
            auVar326 = ZEXT1664(auVar156);
            auVar91 = ZEXT416((uint)(auVar91._0_4_ * (2.0 - fVar199 * auVar91._0_4_)));
            auVar91 = vshufps_avx(auVar91,auVar91,0);
            uVar69 = CONCAT44(auVar281._4_4_,auVar281._0_4_);
            auVar220._0_8_ = uVar69 ^ 0x8000000080000000;
            auVar220._8_4_ = -auVar281._8_4_;
            auVar220._12_4_ = -auVar281._12_4_;
            auVar94 = ZEXT416((uint)(fVar197 * 1.5 + fVar199 * -0.5 * fVar197 * fVar197 * fVar197));
            auVar94 = vshufps_avx(auVar94,auVar94,0);
            auVar183._0_4_ = auVar94._0_4_ * auVar90._0_4_ * auVar91._0_4_;
            auVar183._4_4_ = auVar94._4_4_ * auVar90._4_4_ * auVar91._4_4_;
            auVar183._8_4_ = auVar94._8_4_ * auVar90._8_4_ * auVar91._8_4_;
            auVar183._12_4_ = auVar94._12_4_ * auVar90._12_4_ * auVar91._12_4_;
            auVar243._0_4_ = auVar281._0_4_ * auVar94._0_4_;
            auVar243._4_4_ = auVar281._4_4_ * auVar94._4_4_;
            auVar243._8_4_ = auVar281._8_4_ * auVar94._8_4_;
            auVar243._12_4_ = auVar281._12_4_ * auVar94._12_4_;
            if (fVar199 < 0.0) {
              local_aa0._0_16_ = auVar183;
              fVar199 = sqrtf(fVar199);
              auVar326 = ZEXT464(auVar156._0_4_);
              uVar81 = extraout_RAX_01;
              auVar183 = local_aa0._0_16_;
            }
            else {
              auVar95 = vsqrtss_avx(auVar95,auVar95);
              fVar199 = auVar95._0_4_;
            }
            auVar72._4_4_ = fStack_a3c;
            auVar72._0_4_ = local_a40;
            auVar72._8_4_ = fStack_a38;
            auVar72._12_4_ = fStack_a34;
            auVar95 = vdpps_avx(auVar72,auVar243,0x7f);
            fVar199 = ((float)local_b40._0_4_ / fVar199) * (fVar214 + 1.0) +
                      auVar326._0_4_ + fVar214 * (float)local_b40._0_4_;
            auVar91 = vdpps_avx(auVar220,auVar243,0x7f);
            auVar94 = vdpps_avx(auVar72,auVar183,0x7f);
            auVar90 = vdpps_avx(_local_a70,auVar243,0x7f);
            auVar126 = vdpps_avx(auVar72,auVar220,0x7f);
            fVar214 = auVar91._0_4_ + auVar94._0_4_;
            fVar197 = auVar95._0_4_;
            auVar96._0_4_ = fVar197 * fVar197;
            auVar96._4_4_ = auVar95._4_4_ * auVar95._4_4_;
            auVar96._8_4_ = auVar95._8_4_ * auVar95._8_4_;
            auVar96._12_4_ = auVar95._12_4_ * auVar95._12_4_;
            auVar94 = vsubps_avx(auVar15,auVar96);
            auVar91 = vdpps_avx(auVar72,_local_a70,0x7f);
            fVar215 = auVar126._0_4_ - fVar197 * fVar214;
            fVar198 = auVar91._0_4_ - fVar197 * auVar90._0_4_;
            auVar91 = vrsqrtss_avx(auVar94,auVar94);
            fVar216 = auVar94._0_4_;
            fVar197 = auVar91._0_4_;
            fVar197 = fVar197 * 1.5 + fVar216 * -0.5 * fVar197 * fVar197 * fVar197;
            if (fVar216 < 0.0) {
              local_aa0._0_16_ = ZEXT416((uint)fVar214);
              local_940._0_4_ = fVar215;
              local_960._0_4_ = fVar198;
              local_980._0_4_ = fVar197;
              fVar216 = sqrtf(fVar216);
              auVar326 = ZEXT464(auVar156._0_4_);
              uVar81 = extraout_RAX_02;
              fVar197 = (float)local_980._0_4_;
              fVar215 = (float)local_940._0_4_;
              fVar198 = (float)local_960._0_4_;
              auVar156 = local_aa0._0_16_;
            }
            else {
              auVar156 = vsqrtss_avx(auVar94,auVar94);
              fVar216 = auVar156._0_4_;
              auVar156 = ZEXT416((uint)fVar214);
            }
            auVar339 = ZEXT1664(auVar95);
            auVar271 = ZEXT1664(auVar15);
            auVar314 = ZEXT1664(auVar281);
            auVar97 = vpermilps_avx(local_ac0._0_16_,0xff);
            auVar126 = vshufps_avx(auVar281,auVar281,0xff);
            fVar215 = fVar215 * fVar197 - auVar126._0_4_;
            auVar203._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar203._8_4_ = auVar90._8_4_ ^ 0x80000000;
            auVar203._12_4_ = auVar90._12_4_ ^ 0x80000000;
            auVar221._0_4_ = -fVar215;
            auVar221._4_4_ = 0x80000000;
            auVar221._8_4_ = 0x80000000;
            auVar221._12_4_ = 0x80000000;
            fVar214 = auVar156._0_4_ * fVar198 * fVar197;
            auVar246 = ZEXT464((uint)fVar214);
            auVar91 = vinsertps_avx(auVar221,ZEXT416((uint)(fVar198 * fVar197)),0x1c);
            auVar94 = vmovsldup_avx(ZEXT416((uint)(fVar214 - auVar90._0_4_ * fVar215)));
            auVar91 = vdivps_avx(auVar91,auVar94);
            auVar156 = vinsertps_avx(auVar156,auVar203,0x10);
            auVar156 = vdivps_avx(auVar156,auVar94);
            auVar94 = vmovsldup_avx(auVar95);
            auVar97 = ZEXT416((uint)(fVar216 - auVar97._0_4_));
            auVar90 = vmovsldup_avx(auVar97);
            auVar158._0_4_ = auVar94._0_4_ * auVar91._0_4_ + auVar90._0_4_ * auVar156._0_4_;
            auVar158._4_4_ = auVar94._4_4_ * auVar91._4_4_ + auVar90._4_4_ * auVar156._4_4_;
            auVar158._8_4_ = auVar94._8_4_ * auVar91._8_4_ + auVar90._8_4_ * auVar156._8_4_;
            auVar158._12_4_ = auVar94._12_4_ * auVar91._12_4_ + auVar90._12_4_ * auVar156._12_4_;
            auVar219 = vsubps_avx(auVar219,auVar158);
            auVar159._8_4_ = 0x7fffffff;
            auVar159._0_8_ = 0x7fffffff7fffffff;
            auVar159._12_4_ = 0x7fffffff;
            auVar156 = vandps_avx(auVar95,auVar159);
            if (auVar156._0_4_ < fVar199) {
              auVar184._8_4_ = 0x7fffffff;
              auVar184._0_8_ = 0x7fffffff7fffffff;
              auVar184._12_4_ = 0x7fffffff;
              auVar156 = vandps_avx(auVar97,auVar184);
              if (auVar156._0_4_ < (float)local_a60._0_4_ * 1.9073486e-06 + auVar326._0_4_ + fVar199
                 ) {
                bVar89 = uVar88 < 5;
                fVar199 = auVar219._0_4_ + (float)local_9f0._0_4_;
                if ((fVar178 <= fVar199) &&
                   (fVar197 = *(float *)(ray + k * 4 + 0x100), fVar199 <= fVar197)) {
                  auVar156 = vmovshdup_avx(auVar219);
                  bVar78 = 0;
                  if ((auVar156._0_4_ < 0.0) || (1.0 < auVar156._0_4_)) goto LAB_007b86b0;
                  auVar156 = vrsqrtss_avx(auVar15,auVar15);
                  fVar215 = auVar156._0_4_;
                  pGVar2 = (context->scene->geometries).items[local_af8].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar78 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_007b86b0;
                    auVar156 = ZEXT416((uint)(fVar215 * 1.5 +
                                             fVar196 * -0.5 * fVar215 * fVar215 * fVar215));
                    auVar156 = vshufps_avx(auVar156,auVar156,0);
                    auVar160._0_4_ = auVar156._0_4_ * local_a40;
                    auVar160._4_4_ = auVar156._4_4_ * fStack_a3c;
                    auVar160._8_4_ = auVar156._8_4_ * fStack_a38;
                    auVar160._12_4_ = auVar156._12_4_ * fStack_a34;
                    auVar131._0_4_ = auVar281._0_4_ + auVar126._0_4_ * auVar160._0_4_;
                    auVar131._4_4_ = auVar281._4_4_ + auVar126._4_4_ * auVar160._4_4_;
                    auVar131._8_4_ = auVar281._8_4_ + auVar126._8_4_ * auVar160._8_4_;
                    auVar131._12_4_ = auVar281._12_4_ + auVar126._12_4_ * auVar160._12_4_;
                    auVar156 = vshufps_avx(auVar160,auVar160,0xc9);
                    auVar91 = vshufps_avx(auVar281,auVar281,0xc9);
                    auVar161._0_4_ = auVar91._0_4_ * auVar160._0_4_;
                    auVar161._4_4_ = auVar91._4_4_ * auVar160._4_4_;
                    auVar161._8_4_ = auVar91._8_4_ * auVar160._8_4_;
                    auVar161._12_4_ = auVar91._12_4_ * auVar160._12_4_;
                    auVar185._0_4_ = auVar281._0_4_ * auVar156._0_4_;
                    auVar185._4_4_ = auVar281._4_4_ * auVar156._4_4_;
                    auVar185._8_4_ = auVar281._8_4_ * auVar156._8_4_;
                    auVar185._12_4_ = auVar281._12_4_ * auVar156._12_4_;
                    auVar94 = vsubps_avx(auVar185,auVar161);
                    auVar156 = vshufps_avx(auVar94,auVar94,0xc9);
                    auVar91 = vshufps_avx(auVar131,auVar131,0xc9);
                    auVar186._0_4_ = auVar91._0_4_ * auVar156._0_4_;
                    auVar186._4_4_ = auVar91._4_4_ * auVar156._4_4_;
                    auVar186._8_4_ = auVar91._8_4_ * auVar156._8_4_;
                    auVar186._12_4_ = auVar91._12_4_ * auVar156._12_4_;
                    auVar156 = vshufps_avx(auVar94,auVar94,0xd2);
                    auVar132._0_4_ = auVar131._0_4_ * auVar156._0_4_;
                    auVar132._4_4_ = auVar131._4_4_ * auVar156._4_4_;
                    auVar132._8_4_ = auVar131._8_4_ * auVar156._8_4_;
                    auVar132._12_4_ = auVar131._12_4_ * auVar156._12_4_;
                    auVar156 = vsubps_avx(auVar186,auVar132);
                    pRVar3 = context->user;
                    local_780 = vshufps_avx(auVar219,auVar219,0x55);
                    auStack_7d0 = vshufps_avx(auVar156,auVar156,0x55);
                    local_7c0 = vshufps_avx(auVar156,auVar156,0xaa);
                    local_7a0 = vshufps_avx(auVar156,auVar156,0);
                    local_7e0 = (RTCHitN  [16])auStack_7d0;
                    local_760 = ZEXT832(0) << 0x20;
                    local_740 = local_660._0_8_;
                    uStack_738 = local_660._8_8_;
                    uStack_730 = local_660._16_8_;
                    uStack_728 = local_660._24_8_;
                    local_720 = local_640;
                    auVar19 = vcmpps_avx(local_640,local_640,0xf);
                    local_b00[1] = auVar19;
                    *local_b00 = auVar19;
                    local_700 = pRVar3->instID[0];
                    local_6e0 = pRVar3->instPrimID[0];
                    *(float *)(ray + k * 4 + 0x100) = fVar199;
                    local_ba0 = *local_b08;
                    local_b90 = *local_b10;
                    local_af0.valid = (int *)local_ba0;
                    local_af0.geometryUserPtr = pGVar2->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_7e0;
                    local_af0.N = 8;
                    local_af0.ray = (RTCRayN *)ray;
                    local_7b0 = local_7c0;
                    local_790 = local_7a0;
                    local_770 = local_780;
                    uStack_6fc = local_700;
                    uStack_6f8 = local_700;
                    uStack_6f4 = local_700;
                    uStack_6f0 = local_700;
                    uStack_6ec = local_700;
                    uStack_6e8 = local_700;
                    uStack_6e4 = local_700;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    uStack_6d0 = local_6e0;
                    uStack_6cc = local_6e0;
                    uStack_6c8 = local_6e0;
                    uStack_6c4 = local_6e0;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar246 = ZEXT464((uint)fVar214);
                      auVar271 = ZEXT1664(auVar15);
                      auVar314 = ZEXT1664(auVar281);
                      auVar326 = ZEXT1664(auVar326._0_16_);
                      auVar339 = ZEXT1664(auVar95);
                      (*pGVar2->occlusionFilterN)(&local_af0);
                    }
                    auVar219 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                    auVar15 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                    auVar172._16_16_ = auVar15;
                    auVar172._0_16_ = auVar219;
                    auVar19 = _DAT_01f7b020 & ~auVar172;
                    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0x7f,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar19 >> 0xbf,0) != '\0') ||
                        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar19[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar246 = ZEXT1664(auVar246._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar314 = ZEXT1664(auVar314._0_16_);
                        auVar326 = ZEXT1664(auVar326._0_16_);
                        auVar339 = ZEXT1664(auVar339._0_16_);
                        (*p_Var4)(&local_af0);
                      }
                      auVar219 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar15 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar110._16_16_ = auVar15;
                      auVar110._0_16_ = auVar219;
                      auVar144._8_4_ = 0xff800000;
                      auVar144._0_8_ = 0xff800000ff800000;
                      auVar144._12_4_ = 0xff800000;
                      auVar144._16_4_ = 0xff800000;
                      auVar144._20_4_ = 0xff800000;
                      auVar144._24_4_ = 0xff800000;
                      auVar144._28_4_ = 0xff800000;
                      auVar19 = vblendvps_avx(auVar144,*(undefined1 (*) [32])(local_af0.ray + 0x100)
                                              ,auVar110);
                      *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar19;
                      auVar19 = _DAT_01f7b020 & ~auVar110;
                      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar19 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar19 >> 0x7f,0) != '\0') ||
                            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0xbf,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar19[0x1f] < '\0') {
                        bVar78 = 1;
                        goto LAB_007b86b0;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar197;
                    bVar78 = 0;
                    goto LAB_007b86b0;
                  }
                }
                bVar78 = 0;
                goto LAB_007b86b0;
              }
            }
          }
          bVar89 = false;
LAB_007b86b0:
          uVar87 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar306._4_4_ = uVar87;
          auVar306._0_4_ = uVar87;
          auVar306._8_4_ = uVar87;
          auVar306._12_4_ = uVar87;
          auVar306._16_4_ = uVar87;
          auVar306._20_4_ = uVar87;
          auVar306._24_4_ = uVar87;
          auVar306._28_4_ = uVar87;
          auVar309 = ZEXT3264(auVar306);
          bVar86 = bVar86 | bVar89 & bVar78;
          auVar19 = vcmpps_avx(_local_9a0,auVar306,2);
        }
        auVar111._0_4_ = (float)local_8c0._0_4_ + auVar192._0_4_;
        auVar111._4_4_ = (float)local_8c0._4_4_ + auVar192._4_4_;
        auVar111._8_4_ = fStack_8b8 + auVar192._8_4_;
        auVar111._12_4_ = fStack_8b4 + auVar192._12_4_;
        auVar111._16_4_ = fStack_8b0 + auVar192._16_4_;
        auVar111._20_4_ = fStack_8ac + auVar192._20_4_;
        auVar111._24_4_ = fStack_8a8 + auVar192._24_4_;
        auVar111._28_4_ = fStack_8a4 + auVar192._28_4_;
        auVar219 = vshufps_avx(auVar309._0_16_,auVar309._0_16_,0);
        auVar145._16_16_ = auVar219;
        auVar145._0_16_ = auVar219;
        auVar19 = vcmpps_avx(auVar111,auVar145,2);
        auVar101 = vandps_avx(auVar19,auVar101);
        auVar112._8_4_ = 3;
        auVar112._0_8_ = 0x300000003;
        auVar112._12_4_ = 3;
        auVar112._16_4_ = 3;
        auVar112._20_4_ = 3;
        auVar112._24_4_ = 3;
        auVar112._28_4_ = 3;
        auVar146._8_4_ = 2;
        auVar146._0_8_ = 0x200000002;
        auVar146._12_4_ = 2;
        auVar146._16_4_ = 2;
        auVar146._20_4_ = 2;
        auVar146._24_4_ = 2;
        auVar146._28_4_ = 2;
        auVar19 = vblendvps_avx(auVar146,auVar112,local_860);
        auVar219 = vpcmpgtd_avx(auVar19._16_16_,local_8a0);
        auVar15 = vpshufd_avx(local_880._0_16_,0);
        auVar15 = vpcmpgtd_avx(auVar19._0_16_,auVar15);
        auVar147._16_16_ = auVar219;
        auVar147._0_16_ = auVar15;
        _local_9a0 = vblendps_avx(ZEXT1632(auVar15),auVar147,0xf0);
        local_480 = vandnps_avx(_local_9a0,auVar101);
        local_9c0 = _local_400;
        local_c60._4_4_ = (float)local_8c0._4_4_ + (float)local_400._4_4_;
        local_c60._0_4_ = (float)local_8c0._0_4_ + (float)local_400._0_4_;
        fStack_c58 = fStack_8b8 + fStack_3f8;
        fStack_c54 = fStack_8b4 + fStack_3f4;
        fStack_c50 = fStack_8b0 + fStack_3f0;
        fStack_c4c = fStack_8ac + fStack_3ec;
        fStack_c48 = fStack_8a8 + fStack_3e8;
        fStack_c44 = fStack_8a4 + fStack_3e4;
        for (; (((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_480 >> 0x7f,0) != '\0') ||
                 (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_480 >> 0xbf,0) != '\0') ||
               (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_480[0x1f] < '\0'; local_480 = vandps_avx(auVar19,local_480)) {
          auVar148._8_4_ = 0x7f800000;
          auVar148._0_8_ = 0x7f8000007f800000;
          auVar148._12_4_ = 0x7f800000;
          auVar148._16_4_ = 0x7f800000;
          auVar148._20_4_ = 0x7f800000;
          auVar148._24_4_ = 0x7f800000;
          auVar148._28_4_ = 0x7f800000;
          auVar19 = vblendvps_avx(auVar148,local_9c0,local_480);
          auVar20 = vshufps_avx(auVar19,auVar19,0xb1);
          auVar20 = vminps_avx(auVar19,auVar20);
          auVar192 = vshufpd_avx(auVar20,auVar20,5);
          auVar20 = vminps_avx(auVar20,auVar192);
          auVar192 = vperm2f128_avx(auVar20,auVar20,1);
          auVar20 = vminps_avx(auVar20,auVar192);
          auVar20 = vcmpps_avx(auVar19,auVar20,0);
          auVar192 = local_480 & auVar20;
          auVar19 = local_480;
          if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar192 >> 0x7f,0) != '\0') ||
                (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar192 >> 0xbf,0) != '\0') ||
              (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar192[0x1f] < '\0') {
            auVar19 = vandps_avx(auVar20,local_480);
          }
          uVar79 = vmovmskps_avx(auVar19);
          uVar84 = 0;
          if (uVar79 != 0) {
            for (; (uVar79 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
            }
          }
          uVar81 = (ulong)uVar84;
          *(undefined4 *)(local_480 + uVar81 * 4) = 0;
          fVar199 = local_1c0[uVar81];
          uVar84 = *(uint *)(local_3e0 + uVar81 * 4);
          fVar196 = auVar14._0_4_;
          if ((float)local_a80._0_4_ < 0.0) {
            auVar314 = ZEXT1664(auVar314._0_16_);
            auVar326 = ZEXT1664(auVar326._0_16_);
            auVar339 = ZEXT1664(auVar339._0_16_);
            fVar196 = sqrtf((float)local_a80._0_4_);
            uVar81 = extraout_RAX_03;
          }
          auVar246 = ZEXT464((uint)fVar199);
          auVar271 = ZEXT464(uVar84);
          auVar15 = vminps_avx(_local_b50,_local_b70);
          auVar219 = vmaxps_avx(_local_b50,_local_b70);
          auVar156 = vminps_avx(_local_b60,_local_b80);
          auVar95 = vminps_avx(auVar15,auVar156);
          auVar15 = vmaxps_avx(_local_b60,_local_b80);
          auVar156 = vmaxps_avx(auVar219,auVar15);
          auVar187._8_4_ = 0x7fffffff;
          auVar187._0_8_ = 0x7fffffff7fffffff;
          auVar187._12_4_ = 0x7fffffff;
          auVar219 = vandps_avx(auVar95,auVar187);
          auVar15 = vandps_avx(auVar156,auVar187);
          auVar219 = vmaxps_avx(auVar219,auVar15);
          auVar15 = vmovshdup_avx(auVar219);
          auVar15 = vmaxss_avx(auVar15,auVar219);
          auVar219 = vshufpd_avx(auVar219,auVar219,1);
          auVar219 = vmaxss_avx(auVar219,auVar15);
          local_b40._0_4_ = auVar219._0_4_ * 1.9073486e-06;
          local_a20._0_4_ = fVar196 * 1.9073486e-06;
          local_a60._0_16_ = vshufps_avx(auVar156,auVar156,0xff);
          auVar219 = vinsertps_avx(ZEXT416(uVar84),ZEXT416((uint)fVar199),0x10);
          for (uVar88 = 0; bVar78 = (byte)uVar81, uVar88 != 5; uVar88 = uVar88 + 1) {
            auVar15 = vmovshdup_avx(auVar219);
            fVar199 = auVar15._0_4_;
            fVar215 = 1.0 - fVar199;
            fVar196 = fVar215 * fVar215 * fVar215;
            fVar214 = fVar199 * fVar199 * fVar199;
            fVar197 = fVar199 * fVar215;
            auVar15 = vshufps_avx(ZEXT416((uint)(fVar214 * 0.16666667)),
                                  ZEXT416((uint)(fVar214 * 0.16666667)),0);
            auVar156 = ZEXT416((uint)((fVar214 * 4.0 + fVar196 +
                                      fVar199 * fVar197 * 12.0 + fVar215 * fVar197 * 6.0) *
                                     0.16666667));
            auVar156 = vshufps_avx(auVar156,auVar156,0);
            auVar95 = ZEXT416((uint)((fVar196 * 4.0 + fVar214 +
                                     fVar215 * fVar197 * 12.0 + fVar199 * fVar197 * 6.0) *
                                    0.16666667));
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar91 = vshufps_avx(auVar219,auVar219,0);
            auVar162._0_4_ = auVar91._0_4_ * (float)local_a70._0_4_ + 0.0;
            auVar162._4_4_ = auVar91._4_4_ * (float)local_a70._4_4_ + 0.0;
            auVar162._8_4_ = auVar91._8_4_ * fStack_a68 + 0.0;
            auVar162._12_4_ = auVar91._12_4_ * fStack_a64 + 0.0;
            auVar91 = vshufps_avx(ZEXT416((uint)(fVar196 * 0.16666667)),
                                  ZEXT416((uint)(fVar196 * 0.16666667)),0);
            auVar98._0_4_ =
                 auVar91._0_4_ * (float)local_b50._0_4_ +
                 auVar95._0_4_ * (float)local_b70._0_4_ +
                 auVar15._0_4_ * (float)local_b80._0_4_ + auVar156._0_4_ * (float)local_b60._0_4_;
            auVar98._4_4_ =
                 auVar91._4_4_ * (float)local_b50._4_4_ +
                 auVar95._4_4_ * (float)local_b70._4_4_ +
                 auVar15._4_4_ * (float)local_b80._4_4_ + auVar156._4_4_ * (float)local_b60._4_4_;
            auVar98._8_4_ =
                 auVar91._8_4_ * fStack_b48 +
                 auVar95._8_4_ * fStack_b68 +
                 auVar15._8_4_ * fStack_b78 + auVar156._8_4_ * fStack_b58;
            auVar98._12_4_ =
                 auVar91._12_4_ * fStack_b44 +
                 auVar95._12_4_ * fStack_b64 +
                 auVar15._12_4_ * fStack_b74 + auVar156._12_4_ * fStack_b54;
            local_ac0._0_16_ = auVar98;
            auVar15 = vsubps_avx(auVar162,auVar98);
            local_a40 = auVar15._0_4_;
            fStack_a3c = auVar15._4_4_;
            fStack_a38 = auVar15._8_4_;
            fStack_a34 = auVar15._12_4_;
            auVar15 = vdpps_avx(auVar15,auVar15,0x7f);
            fVar196 = auVar15._0_4_;
            if (fVar196 < 0.0) {
              fVar214 = sqrtf(fVar196);
              uVar81 = extraout_RAX_04;
            }
            else {
              auVar156 = vsqrtss_avx(auVar15,auVar15);
              fVar214 = auVar156._0_4_;
            }
            auVar156 = ZEXT416((uint)(fVar199 * fVar199 * 0.5));
            auVar156 = vshufps_avx(auVar156,auVar156,0);
            auVar95 = ZEXT416((uint)((fVar215 * fVar215 + fVar197 * 4.0) * 0.5));
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar91 = ZEXT416((uint)((fVar199 * -fVar199 - fVar197 * 4.0) * 0.5));
            auVar91 = vshufps_avx(auVar91,auVar91,0);
            auVar94 = ZEXT416((uint)(fVar215 * -fVar215 * 0.5));
            auVar94 = vshufps_avx(auVar94,auVar94,0);
            auVar282._0_4_ =
                 (float)local_b50._0_4_ * auVar94._0_4_ +
                 (float)local_b70._0_4_ * auVar91._0_4_ +
                 (float)local_b80._0_4_ * auVar156._0_4_ + (float)local_b60._0_4_ * auVar95._0_4_;
            auVar282._4_4_ =
                 (float)local_b50._4_4_ * auVar94._4_4_ +
                 (float)local_b70._4_4_ * auVar91._4_4_ +
                 (float)local_b80._4_4_ * auVar156._4_4_ + (float)local_b60._4_4_ * auVar95._4_4_;
            auVar282._8_4_ =
                 fStack_b48 * auVar94._8_4_ +
                 fStack_b68 * auVar91._8_4_ +
                 fStack_b78 * auVar156._8_4_ + fStack_b58 * auVar95._8_4_;
            auVar282._12_4_ =
                 fStack_b44 * auVar94._12_4_ +
                 fStack_b64 * auVar91._12_4_ +
                 fStack_b74 * auVar156._12_4_ + fStack_b54 * auVar95._12_4_;
            auVar156 = vshufps_avx(auVar219,auVar219,0x55);
            auVar95 = ZEXT416((uint)(fVar215 - (fVar199 + fVar199)));
            auVar91 = vshufps_avx(auVar95,auVar95,0);
            auVar95 = ZEXT416((uint)(fVar199 - (fVar215 + fVar215)));
            auVar94 = vshufps_avx(auVar95,auVar95,0);
            auVar90 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
            auVar95 = vdpps_avx(auVar282,auVar282,0x7f);
            auVar133._0_4_ =
                 (float)local_b50._0_4_ * auVar90._0_4_ +
                 (float)local_b70._0_4_ * auVar94._0_4_ +
                 (float)local_b80._0_4_ * auVar156._0_4_ + (float)local_b60._0_4_ * auVar91._0_4_;
            auVar133._4_4_ =
                 (float)local_b50._4_4_ * auVar90._4_4_ +
                 (float)local_b70._4_4_ * auVar94._4_4_ +
                 (float)local_b80._4_4_ * auVar156._4_4_ + (float)local_b60._4_4_ * auVar91._4_4_;
            auVar133._8_4_ =
                 fStack_b48 * auVar90._8_4_ +
                 fStack_b68 * auVar94._8_4_ +
                 fStack_b78 * auVar156._8_4_ + fStack_b58 * auVar91._8_4_;
            auVar133._12_4_ =
                 fStack_b44 * auVar90._12_4_ +
                 fStack_b64 * auVar94._12_4_ +
                 fStack_b74 * auVar156._12_4_ + fStack_b54 * auVar91._12_4_;
            auVar156 = vblendps_avx(auVar95,_DAT_01f45a50,0xe);
            auVar91 = vrsqrtss_avx(auVar156,auVar156);
            fVar197 = auVar91._0_4_;
            fVar199 = auVar95._0_4_;
            auVar91 = vdpps_avx(auVar282,auVar133,0x7f);
            auVar94 = vshufps_avx(auVar95,auVar95,0);
            auVar134._0_4_ = auVar133._0_4_ * auVar94._0_4_;
            auVar134._4_4_ = auVar133._4_4_ * auVar94._4_4_;
            auVar134._8_4_ = auVar133._8_4_ * auVar94._8_4_;
            auVar134._12_4_ = auVar133._12_4_ * auVar94._12_4_;
            auVar91 = vshufps_avx(auVar91,auVar91,0);
            auVar204._0_4_ = auVar282._0_4_ * auVar91._0_4_;
            auVar204._4_4_ = auVar282._4_4_ * auVar91._4_4_;
            auVar204._8_4_ = auVar282._8_4_ * auVar91._8_4_;
            auVar204._12_4_ = auVar282._12_4_ * auVar91._12_4_;
            auVar90 = vsubps_avx(auVar134,auVar204);
            auVar91 = vrcpss_avx(auVar156,auVar156);
            auVar156 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                  ZEXT416((uint)(auVar219._0_4_ * (float)local_a20._0_4_)));
            auVar271 = ZEXT1664(auVar156);
            auVar91 = ZEXT416((uint)(auVar91._0_4_ * (2.0 - fVar199 * auVar91._0_4_)));
            auVar91 = vshufps_avx(auVar91,auVar91,0);
            uVar69 = CONCAT44(auVar282._4_4_,auVar282._0_4_);
            auVar222._0_8_ = uVar69 ^ 0x8000000080000000;
            auVar222._8_4_ = -auVar282._8_4_;
            auVar222._12_4_ = -auVar282._12_4_;
            auVar94 = ZEXT416((uint)(fVar197 * 1.5 + fVar199 * -0.5 * fVar197 * fVar197 * fVar197));
            auVar94 = vshufps_avx(auVar94,auVar94,0);
            auVar188._0_4_ = auVar94._0_4_ * auVar90._0_4_ * auVar91._0_4_;
            auVar188._4_4_ = auVar94._4_4_ * auVar90._4_4_ * auVar91._4_4_;
            auVar188._8_4_ = auVar94._8_4_ * auVar90._8_4_ * auVar91._8_4_;
            auVar188._12_4_ = auVar94._12_4_ * auVar90._12_4_ * auVar91._12_4_;
            auVar244._0_4_ = auVar282._0_4_ * auVar94._0_4_;
            auVar244._4_4_ = auVar282._4_4_ * auVar94._4_4_;
            auVar244._8_4_ = auVar282._8_4_ * auVar94._8_4_;
            auVar244._12_4_ = auVar282._12_4_ * auVar94._12_4_;
            if (fVar199 < 0.0) {
              local_aa0._0_16_ = auVar188;
              fVar199 = sqrtf(fVar199);
              auVar271 = ZEXT464(auVar156._0_4_);
              uVar81 = extraout_RAX_05;
              auVar188 = local_aa0._0_16_;
            }
            else {
              auVar95 = vsqrtss_avx(auVar95,auVar95);
              fVar199 = auVar95._0_4_;
            }
            auVar73._4_4_ = fStack_a3c;
            auVar73._0_4_ = local_a40;
            auVar73._8_4_ = fStack_a38;
            auVar73._12_4_ = fStack_a34;
            auVar95 = vdpps_avx(auVar73,auVar244,0x7f);
            fVar199 = ((float)local_b40._0_4_ / fVar199) * (fVar214 + 1.0) +
                      fVar214 * (float)local_b40._0_4_ + auVar271._0_4_;
            auVar91 = vdpps_avx(auVar222,auVar244,0x7f);
            auVar94 = vdpps_avx(auVar73,auVar188,0x7f);
            auVar90 = vdpps_avx(_local_a70,auVar244,0x7f);
            auVar126 = vdpps_avx(auVar73,auVar222,0x7f);
            fVar214 = auVar91._0_4_ + auVar94._0_4_;
            fVar197 = auVar95._0_4_;
            auVar99._0_4_ = fVar197 * fVar197;
            auVar99._4_4_ = auVar95._4_4_ * auVar95._4_4_;
            auVar99._8_4_ = auVar95._8_4_ * auVar95._8_4_;
            auVar99._12_4_ = auVar95._12_4_ * auVar95._12_4_;
            auVar94 = vsubps_avx(auVar15,auVar99);
            auVar91 = vdpps_avx(auVar73,_local_a70,0x7f);
            fVar215 = auVar126._0_4_ - fVar197 * fVar214;
            fVar198 = auVar91._0_4_ - fVar197 * auVar90._0_4_;
            auVar91 = vrsqrtss_avx(auVar94,auVar94);
            fVar216 = auVar94._0_4_;
            fVar197 = auVar91._0_4_;
            fVar197 = fVar197 * 1.5 + fVar216 * -0.5 * fVar197 * fVar197 * fVar197;
            if (fVar216 < 0.0) {
              local_aa0._0_16_ = ZEXT416((uint)fVar214);
              local_940._0_4_ = fVar215;
              local_960._0_4_ = fVar198;
              local_980._0_4_ = fVar197;
              fVar216 = sqrtf(fVar216);
              auVar271 = ZEXT464(auVar156._0_4_);
              uVar81 = extraout_RAX_06;
              fVar197 = (float)local_980._0_4_;
              fVar215 = (float)local_940._0_4_;
              fVar198 = (float)local_960._0_4_;
              auVar156 = local_aa0._0_16_;
            }
            else {
              auVar156 = vsqrtss_avx(auVar94,auVar94);
              fVar216 = auVar156._0_4_;
              auVar156 = ZEXT416((uint)fVar214);
            }
            auVar339 = ZEXT464((uint)fVar199);
            auVar314 = ZEXT1664(auVar15);
            auVar326 = ZEXT1664(auVar282);
            auVar97 = vpermilps_avx(local_ac0._0_16_,0xff);
            auVar126 = vshufps_avx(auVar282,auVar282,0xff);
            fVar215 = fVar215 * fVar197 - auVar126._0_4_;
            auVar205._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar205._8_4_ = auVar90._8_4_ ^ 0x80000000;
            auVar205._12_4_ = auVar90._12_4_ ^ 0x80000000;
            auVar223._0_4_ = -fVar215;
            auVar223._4_4_ = 0x80000000;
            auVar223._8_4_ = 0x80000000;
            auVar223._12_4_ = 0x80000000;
            fVar214 = auVar156._0_4_ * fVar198 * fVar197;
            auVar246 = ZEXT464((uint)fVar214);
            auVar91 = vinsertps_avx(auVar223,ZEXT416((uint)(fVar198 * fVar197)),0x1c);
            auVar94 = vmovsldup_avx(ZEXT416((uint)(fVar214 - auVar90._0_4_ * fVar215)));
            auVar91 = vdivps_avx(auVar91,auVar94);
            auVar156 = vinsertps_avx(auVar156,auVar205,0x10);
            auVar156 = vdivps_avx(auVar156,auVar94);
            auVar94 = vmovsldup_avx(auVar95);
            auVar97 = ZEXT416((uint)(fVar216 - auVar97._0_4_));
            auVar90 = vmovsldup_avx(auVar97);
            auVar163._0_4_ = auVar94._0_4_ * auVar91._0_4_ + auVar90._0_4_ * auVar156._0_4_;
            auVar163._4_4_ = auVar94._4_4_ * auVar91._4_4_ + auVar90._4_4_ * auVar156._4_4_;
            auVar163._8_4_ = auVar94._8_4_ * auVar91._8_4_ + auVar90._8_4_ * auVar156._8_4_;
            auVar163._12_4_ = auVar94._12_4_ * auVar91._12_4_ + auVar90._12_4_ * auVar156._12_4_;
            auVar219 = vsubps_avx(auVar219,auVar163);
            auVar164._8_4_ = 0x7fffffff;
            auVar164._0_8_ = 0x7fffffff7fffffff;
            auVar164._12_4_ = 0x7fffffff;
            auVar156 = vandps_avx(auVar95,auVar164);
            if (auVar156._0_4_ < fVar199) {
              auVar189._8_4_ = 0x7fffffff;
              auVar189._0_8_ = 0x7fffffff7fffffff;
              auVar189._12_4_ = 0x7fffffff;
              auVar156 = vandps_avx(auVar97,auVar189);
              if (auVar156._0_4_ < (float)local_a60._0_4_ * 1.9073486e-06 + fVar199 + auVar271._0_4_
                 ) {
                bVar89 = uVar88 < 5;
                fVar197 = auVar219._0_4_ + (float)local_9f0._0_4_;
                if ((fVar178 <= fVar197) &&
                   (fVar215 = *(float *)(ray + k * 4 + 0x100), fVar197 <= fVar215)) {
                  auVar156 = vmovshdup_avx(auVar219);
                  bVar78 = 0;
                  if ((auVar156._0_4_ < 0.0) || (1.0 < auVar156._0_4_)) goto LAB_007b91fc;
                  auVar156 = vrsqrtss_avx(auVar15,auVar15);
                  fVar198 = auVar156._0_4_;
                  pGVar2 = (context->scene->geometries).items[local_af8].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar78 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_007b91fc;
                    auVar156 = ZEXT416((uint)(fVar198 * 1.5 +
                                             fVar196 * -0.5 * fVar198 * fVar198 * fVar198));
                    auVar156 = vshufps_avx(auVar156,auVar156,0);
                    auVar165._0_4_ = auVar156._0_4_ * local_a40;
                    auVar165._4_4_ = auVar156._4_4_ * fStack_a3c;
                    auVar165._8_4_ = auVar156._8_4_ * fStack_a38;
                    auVar165._12_4_ = auVar156._12_4_ * fStack_a34;
                    auVar135._0_4_ = auVar282._0_4_ + auVar126._0_4_ * auVar165._0_4_;
                    auVar135._4_4_ = auVar282._4_4_ + auVar126._4_4_ * auVar165._4_4_;
                    auVar135._8_4_ = auVar282._8_4_ + auVar126._8_4_ * auVar165._8_4_;
                    auVar135._12_4_ = auVar282._12_4_ + auVar126._12_4_ * auVar165._12_4_;
                    auVar156 = vshufps_avx(auVar165,auVar165,0xc9);
                    auVar95 = vshufps_avx(auVar282,auVar282,0xc9);
                    auVar166._0_4_ = auVar95._0_4_ * auVar165._0_4_;
                    auVar166._4_4_ = auVar95._4_4_ * auVar165._4_4_;
                    auVar166._8_4_ = auVar95._8_4_ * auVar165._8_4_;
                    auVar166._12_4_ = auVar95._12_4_ * auVar165._12_4_;
                    auVar190._0_4_ = auVar282._0_4_ * auVar156._0_4_;
                    auVar190._4_4_ = auVar282._4_4_ * auVar156._4_4_;
                    auVar190._8_4_ = auVar282._8_4_ * auVar156._8_4_;
                    auVar190._12_4_ = auVar282._12_4_ * auVar156._12_4_;
                    auVar91 = vsubps_avx(auVar190,auVar166);
                    auVar156 = vshufps_avx(auVar91,auVar91,0xc9);
                    auVar95 = vshufps_avx(auVar135,auVar135,0xc9);
                    auVar191._0_4_ = auVar95._0_4_ * auVar156._0_4_;
                    auVar191._4_4_ = auVar95._4_4_ * auVar156._4_4_;
                    auVar191._8_4_ = auVar95._8_4_ * auVar156._8_4_;
                    auVar191._12_4_ = auVar95._12_4_ * auVar156._12_4_;
                    auVar156 = vshufps_avx(auVar91,auVar91,0xd2);
                    auVar136._0_4_ = auVar135._0_4_ * auVar156._0_4_;
                    auVar136._4_4_ = auVar135._4_4_ * auVar156._4_4_;
                    auVar136._8_4_ = auVar135._8_4_ * auVar156._8_4_;
                    auVar136._12_4_ = auVar135._12_4_ * auVar156._12_4_;
                    auVar156 = vsubps_avx(auVar191,auVar136);
                    pRVar3 = context->user;
                    local_780 = vshufps_avx(auVar219,auVar219,0x55);
                    auStack_7d0 = vshufps_avx(auVar156,auVar156,0x55);
                    local_7c0 = vshufps_avx(auVar156,auVar156,0xaa);
                    local_7a0 = vshufps_avx(auVar156,auVar156,0);
                    local_7e0 = (RTCHitN  [16])auStack_7d0;
                    local_760 = ZEXT832(0) << 0x20;
                    local_740 = local_660._0_8_;
                    uStack_738 = local_660._8_8_;
                    uStack_730 = local_660._16_8_;
                    uStack_728 = local_660._24_8_;
                    local_720 = local_640;
                    auVar19 = vcmpps_avx(local_640,local_640,0xf);
                    local_b00[1] = auVar19;
                    *local_b00 = auVar19;
                    local_700 = pRVar3->instID[0];
                    local_6e0 = pRVar3->instPrimID[0];
                    *(float *)(ray + k * 4 + 0x100) = fVar197;
                    local_ba0 = *local_b08;
                    local_b90 = *local_b10;
                    local_af0.valid = (int *)local_ba0;
                    local_af0.geometryUserPtr = pGVar2->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_7e0;
                    local_af0.N = 8;
                    local_af0.ray = (RTCRayN *)ray;
                    local_7b0 = local_7c0;
                    local_790 = local_7a0;
                    local_770 = local_780;
                    uStack_6fc = local_700;
                    uStack_6f8 = local_700;
                    uStack_6f4 = local_700;
                    uStack_6f0 = local_700;
                    uStack_6ec = local_700;
                    uStack_6e8 = local_700;
                    uStack_6e4 = local_700;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    uStack_6d0 = local_6e0;
                    uStack_6cc = local_6e0;
                    uStack_6c8 = local_6e0;
                    uStack_6c4 = local_6e0;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar246 = ZEXT464((uint)fVar214);
                      auVar271 = ZEXT1664(auVar271._0_16_);
                      auVar314 = ZEXT1664(auVar15);
                      auVar326 = ZEXT1664(auVar282);
                      auVar339 = ZEXT464((uint)fVar199);
                      (*pGVar2->occlusionFilterN)(&local_af0);
                    }
                    auVar219 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                    auVar15 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                    auVar173._16_16_ = auVar15;
                    auVar173._0_16_ = auVar219;
                    auVar19 = _DAT_01f7b020 & ~auVar173;
                    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0x7f,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar19 >> 0xbf,0) != '\0') ||
                        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar19[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar246 = ZEXT1664(auVar246._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        auVar314 = ZEXT1664(auVar314._0_16_);
                        auVar326 = ZEXT1664(auVar326._0_16_);
                        auVar339 = ZEXT1664(auVar339._0_16_);
                        (*p_Var4)(&local_af0);
                      }
                      auVar219 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar15 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar113._16_16_ = auVar15;
                      auVar113._0_16_ = auVar219;
                      auVar149._8_4_ = 0xff800000;
                      auVar149._0_8_ = 0xff800000ff800000;
                      auVar149._12_4_ = 0xff800000;
                      auVar149._16_4_ = 0xff800000;
                      auVar149._20_4_ = 0xff800000;
                      auVar149._24_4_ = 0xff800000;
                      auVar149._28_4_ = 0xff800000;
                      auVar19 = vblendvps_avx(auVar149,*(undefined1 (*) [32])(local_af0.ray + 0x100)
                                              ,auVar113);
                      *(undefined1 (*) [32])(local_af0.ray + 0x100) = auVar19;
                      auVar19 = _DAT_01f7b020 & ~auVar113;
                      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar19 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar19 >> 0x7f,0) != '\0') ||
                            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0xbf,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar19[0x1f] < '\0') {
                        bVar78 = 1;
                        goto LAB_007b91fc;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar215;
                  }
                }
                bVar78 = 0;
                goto LAB_007b91fc;
              }
            }
          }
          bVar89 = false;
LAB_007b91fc:
          uVar87 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar307._4_4_ = uVar87;
          auVar307._0_4_ = uVar87;
          auVar307._8_4_ = uVar87;
          auVar307._12_4_ = uVar87;
          auVar307._16_4_ = uVar87;
          auVar307._20_4_ = uVar87;
          auVar307._24_4_ = uVar87;
          auVar307._28_4_ = uVar87;
          auVar309 = ZEXT3264(auVar307);
          bVar86 = bVar86 | bVar89 & bVar78;
          auVar19 = vcmpps_avx(_local_c60,auVar307,2);
        }
        auVar19 = vandps_avx(local_840,local_820);
        auVar101 = vandps_avx(_local_9a0,auVar101);
        auVar174._0_4_ = (float)local_8c0._0_4_ + local_440._0_4_;
        auVar174._4_4_ = (float)local_8c0._4_4_ + local_440._4_4_;
        auVar174._8_4_ = fStack_8b8 + local_440._8_4_;
        auVar174._12_4_ = fStack_8b4 + local_440._12_4_;
        auVar174._16_4_ = fStack_8b0 + local_440._16_4_;
        auVar174._20_4_ = fStack_8ac + local_440._20_4_;
        auVar174._24_4_ = fStack_8a8 + local_440._24_4_;
        auVar174._28_4_ = fStack_8a4 + local_440._28_4_;
        auVar219 = vshufps_avx(auVar309._0_16_,auVar309._0_16_,0);
        auVar213._16_16_ = auVar219;
        auVar213._0_16_ = auVar219;
        auVar20 = vcmpps_avx(auVar174,auVar213,2);
        auVar19 = vandps_avx(auVar20,auVar19);
        auVar232._0_4_ = (float)local_8c0._0_4_ + local_400._0_4_;
        auVar232._4_4_ = (float)local_8c0._4_4_ + local_400._4_4_;
        auVar232._8_4_ = fStack_8b8 + local_400._8_4_;
        auVar232._12_4_ = fStack_8b4 + local_400._12_4_;
        auVar232._16_4_ = fStack_8b0 + local_400._16_4_;
        auVar232._20_4_ = fStack_8ac + local_400._20_4_;
        auVar232._24_4_ = fStack_8a8 + local_400._24_4_;
        auVar232._28_4_ = fStack_8a4 + local_400._28_4_;
        auVar20 = vcmpps_avx(auVar232,auVar213,2);
        auVar101 = vandps_avx(auVar20,auVar101);
        auVar101 = vorps_avx(auVar19,auVar101);
        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0x7f,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar101 >> 0xbf,0) != '\0') ||
            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar101[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar85 * 0x60) = auVar101;
          auVar101 = vblendvps_avx(_local_400,_local_440,auVar19);
          *(undefined1 (*) [32])(auStack_160 + uVar85 * 0x60) = auVar101;
          uVar81 = vmovlps_avx(local_7f0);
          (&uStack_140)[uVar85 * 0xc] = uVar81;
          auStack_138[uVar85 * 0x18] = local_d2c + 1;
          uVar85 = (ulong)((int)uVar85 + 1);
        }
      }
      auVar309 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
    }
    while( true ) {
      uVar84 = (uint)uVar85;
      if (uVar84 == 0) {
        if (bVar86 != 0) goto LAB_007b9790;
        uVar87 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar100._4_4_ = uVar87;
        auVar100._0_4_ = uVar87;
        auVar100._8_4_ = uVar87;
        auVar100._12_4_ = uVar87;
        auVar127 = vcmpps_avx(local_800,auVar100,2);
        uVar84 = vmovmskps_avx(auVar127);
        local_9c8 = (ulong)((uint)local_9d0 & uVar84);
        goto LAB_007b6bdf;
      }
      uVar85 = (ulong)(uVar84 - 1);
      lVar80 = uVar85 * 0x60;
      auVar101 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar107._0_4_ = auVar101._0_4_ + (float)local_8c0._0_4_;
      auVar107._4_4_ = auVar101._4_4_ + (float)local_8c0._4_4_;
      auVar107._8_4_ = auVar101._8_4_ + fStack_8b8;
      auVar107._12_4_ = auVar101._12_4_ + fStack_8b4;
      auVar107._16_4_ = auVar101._16_4_ + fStack_8b0;
      auVar107._20_4_ = auVar101._20_4_ + fStack_8ac;
      auVar107._24_4_ = auVar101._24_4_ + fStack_8a8;
      auVar107._28_4_ = auVar101._28_4_ + fStack_8a4;
      uVar87 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar193._4_4_ = uVar87;
      auVar193._0_4_ = uVar87;
      auVar193._8_4_ = uVar87;
      auVar193._12_4_ = uVar87;
      auVar193._16_4_ = uVar87;
      auVar193._20_4_ = uVar87;
      auVar193._24_4_ = uVar87;
      auVar193._28_4_ = uVar87;
      auVar19 = vcmpps_avx(auVar107,auVar193,2);
      _local_7e0 = vandps_avx(auVar19,*(undefined1 (*) [32])(auStack_180 + lVar80));
      auVar19 = *(undefined1 (*) [32])(auStack_180 + lVar80) & auVar19;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') break;
      uVar85 = (ulong)(uVar84 - 1);
    }
    auVar169._8_4_ = 0x7f800000;
    auVar169._0_8_ = 0x7f8000007f800000;
    auVar169._12_4_ = 0x7f800000;
    auVar169._16_4_ = 0x7f800000;
    auVar169._20_4_ = 0x7f800000;
    auVar169._24_4_ = 0x7f800000;
    auVar169._28_4_ = 0x7f800000;
    auVar101 = vblendvps_avx(auVar169,auVar101,_local_7e0);
    auVar19 = vshufps_avx(auVar101,auVar101,0xb1);
    auVar19 = vminps_avx(auVar101,auVar19);
    auVar20 = vshufpd_avx(auVar19,auVar19,5);
    auVar19 = vminps_avx(auVar19,auVar20);
    auVar20 = vperm2f128_avx(auVar19,auVar19,1);
    auVar19 = vminps_avx(auVar19,auVar20);
    auVar19 = vcmpps_avx(auVar101,auVar19,0);
    auVar20 = _local_7e0 & auVar19;
    auVar101 = _local_7e0;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar101 = vandps_avx(auVar19,_local_7e0);
    }
    auVar128._8_8_ = 0;
    auVar128._0_8_ = (&uStack_140)[uVar85 * 0xc];
    local_d2c = auStack_138[uVar85 * 0x18];
    uVar82 = vmovmskps_avx(auVar101);
    uVar79 = 0;
    if (uVar82 != 0) {
      for (; (uVar82 >> uVar79 & 1) == 0; uVar79 = uVar79 + 1) {
      }
    }
    *(undefined4 *)(local_7e0 + (ulong)uVar79 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar80) = _local_7e0;
    uVar82 = uVar84 - 1;
    if ((((((((_local_7e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7e0 >> 0x7f,0) != '\0') ||
          (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7e0 >> 0xbf,0) != '\0') ||
        (_local_7e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7e0[0x1f] < '\0') {
      uVar82 = uVar84;
    }
    auVar219 = vshufps_avx(auVar128,auVar128,0);
    auVar15 = vshufps_avx(auVar128,auVar128,0x55);
    auVar15 = vsubps_avx(auVar15,auVar219);
    local_440._4_4_ = auVar219._4_4_ + auVar15._4_4_ * 0.14285715;
    local_440._0_4_ = auVar219._0_4_ + auVar15._0_4_ * 0.0;
    fStack_438 = auVar219._8_4_ + auVar15._8_4_ * 0.2857143;
    fStack_434 = auVar219._12_4_ + auVar15._12_4_ * 0.42857146;
    fStack_430 = auVar219._0_4_ + auVar15._0_4_ * 0.5714286;
    fStack_42c = auVar219._4_4_ + auVar15._4_4_ * 0.71428573;
    fStack_428 = auVar219._8_4_ + auVar15._8_4_ * 0.8571429;
    fStack_424 = auVar219._12_4_ + auVar15._12_4_;
    local_7f0._8_8_ = 0;
    local_7f0._0_8_ = *(ulong *)(local_440 + (ulong)uVar79 * 4);
    uVar85 = (ulong)uVar82;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }